

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 (*pauVar23) [16];
  long in_RSI;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar32;
  ulong uVar28;
  float fVar33;
  undefined1 auVar30 [16];
  ulong uVar29;
  float fVar36;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar31 [16];
  int iVar37;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m128 two;
  __m128 one_2;
  __m128 two_1;
  __m128 one_7;
  v4sf y_1;
  v4sf z_1;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf y_4;
  v4sf z_4;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_4;
  v4sf pow2n;
  v4sf y;
  v4sf z;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf z_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_5;
  v4sf fx_3;
  v4sf tmp_5;
  __m128 one_3;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf z_2;
  v4sf mask_2;
  v4sf one_4;
  v4si emm0_2;
  v4sf fx_1;
  v4sf tmp_2;
  undefined8 in_stack_ffffffffffffdd40;
  Mat *in_stack_ffffffffffffdd48;
  undefined8 local_2258;
  undefined8 uStack_2250;
  int local_2244;
  Mat local_2240;
  undefined1 (*local_21f8) [16];
  int local_21ec;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  int local_21d0;
  Mat local_21c0;
  undefined1 (*local_2178) [16];
  int local_2170;
  int local_216c;
  int local_2168;
  int local_2164;
  int local_2160;
  int local_215c;
  undefined1 (*local_2138) [16];
  undefined1 (*local_2130) [16];
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined1 (*local_20f0) [16];
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined1 (*local_20d0) [16];
  float local_20c8;
  float fStack_20c4;
  float fStack_20c0;
  float fStack_20bc;
  undefined1 local_20b8 [8];
  float fStack_20b0;
  float fStack_20ac;
  float local_20a8;
  float fStack_20a4;
  float fStack_20a0;
  float fStack_209c;
  undefined1 local_2098 [8];
  float fStack_2090;
  float fStack_208c;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  ulong local_2068;
  ulong uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined1 local_2048 [8];
  float fStack_2040;
  float fStack_203c;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  ulong local_1ff8;
  ulong uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined1 local_1fd8 [8];
  float fStack_1fd0;
  float fStack_1fcc;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  float local_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  int local_1f78;
  int iStack_1f74;
  int iStack_1f70;
  int iStack_1f6c;
  float local_1f68;
  float fStack_1f64;
  float fStack_1f60;
  float fStack_1f5c;
  int local_1f58;
  int iStack_1f54;
  int iStack_1f50;
  int iStack_1f4c;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  int local_1f38;
  int iStack_1f34;
  int iStack_1f30;
  int iStack_1f2c;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  float local_1d48;
  float fStack_1d44;
  float fStack_1d40;
  float fStack_1d3c;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  int local_1d28;
  int iStack_1d24;
  int iStack_1d20;
  int iStack_1d1c;
  float local_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  int local_1d08;
  int iStack_1d04;
  int iStack_1d00;
  int iStack_1cfc;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  int local_1ce8;
  int iStack_1ce4;
  int iStack_1ce0;
  int iStack_1cdc;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined4 local_11a8;
  undefined4 uStack_11a4;
  undefined4 uStack_11a0;
  undefined4 uStack_119c;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 uStack_1184;
  undefined4 uStack_1180;
  undefined4 uStack_117c;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 uStack_1164;
  undefined4 uStack_1160;
  undefined4 uStack_115c;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined4 uStack_1124;
  undefined4 uStack_1120;
  undefined4 uStack_111c;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined4 uStack_1104;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined4 local_10ec;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  ulong local_fd8;
  ulong uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  ulong uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 local_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined4 local_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  ulong uStack_580;
  ulong local_578;
  ulong uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  ulong local_558;
  ulong uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  ulong local_538;
  ulong uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  ulong local_518;
  ulong uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  ulong uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_428;
  ulong uStack_420;
  ulong local_418;
  ulong uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  Mat *local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Mat *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 extraout_XMM0_Qb;
  
  local_215c = *(int *)(in_RSI + 0x2c);
  local_2160 = *(int *)(in_RSI + 0x30);
  local_2164 = *(int *)(in_RSI + 0x38);
  local_2168 = local_215c * local_2160;
  local_216c = *(int *)(in_RSI + 0x18);
  if (local_216c == 4) {
    local_216c = 4;
    for (local_2170 = 0; local_2170 < local_2164; local_2170 = local_2170 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdd48,(int)((ulong)in_stack_ffffffffffffdd40 >> 0x20));
      pauVar23 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_21c0);
      ncnn::Mat::~Mat((Mat *)0x8eb102);
      local_2178 = pauVar23;
      for (local_21d0 = 0; local_21d0 < local_2168; local_21d0 = local_21d0 + 1) {
        local_2130 = local_2178;
        local_2118 = *(undefined8 *)*local_2178;
        uStack_2110 = *(undefined8 *)(*local_2178 + 8);
        auVar31 = *local_2178;
        local_6f8 = 0;
        uStack_6f0 = 0;
        local_1f48 = 0x3f8000003f800000;
        uStack_1f40 = 0x3f8000003f800000;
        local_2c8 = 0x42b0c0a542b0c0a5;
        uStack_2c0 = 0x42b0c0a542b0c0a5;
        auVar22._8_8_ = 0x42b0c0a542b0c0a5;
        auVar22._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(*local_2178,auVar22);
        local_1708 = auVar30._0_8_;
        local_618 = local_1708;
        uStack_1700 = auVar30._8_8_;
        uStack_610 = uStack_1700;
        local_688 = 0xc2b0c0a5c2b0c0a5;
        uStack_680 = 0xc2b0c0a5c2b0c0a5;
        auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar12);
        local_1708 = auVar30._0_8_;
        uVar1 = local_1708;
        uStack_1700 = auVar30._8_8_;
        uVar2 = uStack_1700;
        local_15b8 = 0x3fb8aa3b3fb8aa3b;
        uStack_15b0 = 0x3fb8aa3b3fb8aa3b;
        local_15a8._0_4_ = auVar30._0_4_;
        local_15a8._4_4_ = auVar30._4_4_;
        uStack_15a0._0_4_ = auVar30._8_4_;
        uStack_15a0._4_4_ = auVar30._12_4_;
        local_14a8 = CONCAT44(local_15a8._4_4_ * 1.442695,(float)local_15a8 * 1.442695);
        uStack_14a0 = CONCAT44(uStack_15a0._4_4_ * 1.442695,(float)uStack_15a0 * 1.442695);
        local_1ef8 = 0x3f0000003f000000;
        uStack_1ef0 = 0x3f0000003f000000;
        fVar27 = (float)local_15a8 * 1.442695 + 0.5;
        fVar32 = local_15a8._4_4_ * 1.442695 + 0.5;
        fVar33 = (float)uStack_15a0 * 1.442695 + 0.5;
        fVar36 = uStack_15a0._4_4_ * 1.442695 + 0.5;
        local_1d8 = CONCAT44(fVar32,fVar27);
        uStack_1d0 = CONCAT44(fVar36,fVar33);
        local_338 = CONCAT44((int)fVar32,(int)fVar27);
        uStack_330 = CONCAT44((int)fVar36,(int)fVar33);
        local_1728 = (float)(int)fVar27;
        fStack_1724 = (float)(int)fVar32;
        fStack_1720 = (float)(int)fVar33;
        fStack_171c = (float)(int)fVar36;
        local_1718 = CONCAT44(fStack_1724,local_1728);
        uStack_1710 = CONCAT44(fStack_171c,fStack_1720);
        local_158 = local_1718;
        uStack_150 = uStack_1710;
        local_168 = CONCAT44(fVar32,fVar27);
        uStack_160 = CONCAT44(fVar36,fVar33);
        local_1758 = CONCAT44(-(uint)(fVar32 < fStack_1724),-(uint)(fVar27 < local_1728));
        uStack_1750 = CONCAT44(-(uint)(fVar36 < fStack_171c),-(uint)(fVar33 < fStack_1720));
        local_4f8 = local_1758;
        uStack_4f0 = uStack_1750;
        local_508 = 0x3f8000003f800000;
        uStack_500 = 0x3f8000003f800000;
        local_1758 = local_1758 & 0x3f8000003f800000;
        uStack_1750 = uStack_1750 & 0x3f8000003f800000;
        local_1038 = local_1718;
        uStack_1030 = uStack_1710;
        local_1048._0_4_ = (float)local_1758;
        local_1048._4_4_ = (float)(local_1758 >> 0x20);
        uStack_1040._0_4_ = (float)uStack_1750;
        uStack_1040._4_4_ = (float)(uStack_1750 >> 0x20);
        local_1728 = local_1728 - (float)local_1048;
        fStack_1724 = fStack_1724 - local_1048._4_4_;
        fStack_1720 = fStack_1720 - (float)uStack_1040;
        fStack_171c = fStack_171c - uStack_1040._4_4_;
        local_15c8 = CONCAT44(fStack_1724,local_1728);
        uStack_15c0 = CONCAT44(fStack_171c,fStack_1720);
        local_1f18 = 0x3f3180003f318000;
        uStack_1f10 = 0x3f3180003f318000;
        local_1718 = CONCAT44(fStack_1724 * 0.6933594,local_1728 * 0.6933594);
        uStack_1710 = CONCAT44(fStack_171c * 0.6933594,fStack_1720 * 0.6933594);
        local_15e8 = CONCAT44(fStack_1724,local_1728);
        uStack_15e0 = CONCAT44(fStack_171c,fStack_1720);
        local_1ed8 = 0xb95e8083b95e8083;
        uStack_1ed0 = 0xb95e8083b95e8083;
        local_1058 = local_1708;
        uStack_1050 = uStack_1700;
        local_1068 = local_1718;
        uStack_1060 = uStack_1710;
        local_15a8._0_4_ = (float)local_15a8 - local_1728 * 0.6933594;
        local_15a8._4_4_ = local_15a8._4_4_ - fStack_1724 * 0.6933594;
        uStack_15a0._0_4_ = (float)uStack_15a0 - fStack_1720 * 0.6933594;
        uStack_15a0._4_4_ = uStack_15a0._4_4_ - fStack_171c * 0.6933594;
        local_1708 = CONCAT44(local_15a8._4_4_,(float)local_15a8);
        uStack_1700._0_4_ = (float)uStack_15a0;
        uStack_1700._4_4_ = uStack_15a0._4_4_;
        local_1078 = local_1708;
        uStack_1070 = uStack_1700;
        local_1088 = CONCAT44(fStack_1724 * -0.00021219444,local_1728 * -0.00021219444);
        uStack_1080 = CONCAT44(fStack_171c * -0.00021219444,fStack_1720 * -0.00021219444);
        local_15a8._0_4_ = (float)local_15a8 - local_1728 * -0.00021219444;
        local_15a8._4_4_ = local_15a8._4_4_ - fStack_1724 * -0.00021219444;
        uStack_15a0._0_4_ = (float)uStack_15a0 - fStack_1720 * -0.00021219444;
        uStack_15a0._4_4_ = uStack_15a0._4_4_ - fStack_171c * -0.00021219444;
        local_1708 = CONCAT44(local_15a8._4_4_,(float)local_15a8);
        uStack_1700._0_4_ = (float)uStack_15a0;
        uStack_1700._4_4_ = uStack_15a0._4_4_;
        local_1618 = local_1708;
        uStack_1610 = uStack_1700;
        local_1768 = (float)local_15a8 * (float)local_15a8;
        fStack_1764 = local_15a8._4_4_ * local_15a8._4_4_;
        fStack_1760 = (float)uStack_15a0 * (float)uStack_15a0;
        fStack_175c = uStack_15a0._4_4_ * uStack_15a0._4_4_;
        local_1628 = 0x3950696739506967;
        uStack_1620 = 0x3950696739506967;
        local_1638 = local_1708;
        uStack_1630 = uStack_1700;
        local_1778 = CONCAT44(local_15a8._4_4_ * 0.00019875691,(float)local_15a8 * 0.00019875691);
        uStack_1770 = CONCAT44(uStack_15a0._4_4_ * 0.00019875691,(float)uStack_15a0 * 0.00019875691)
        ;
        local_14c8 = local_1778;
        uStack_14c0 = uStack_1770;
        local_14d8 = 0x3ab743ce3ab743ce;
        uStack_14d0 = 0x3ab743ce3ab743ce;
        fVar27 = (float)local_15a8 * 0.00019875691 + 0.0013981999;
        fVar32 = local_15a8._4_4_ * 0.00019875691 + 0.0013981999;
        fVar33 = (float)uStack_15a0 * 0.00019875691 + 0.0013981999;
        fVar36 = uStack_15a0._4_4_ * 0.00019875691 + 0.0013981999;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1648 = local_1778;
        uStack_1640 = uStack_1770;
        local_1658 = local_1708;
        uStack_1650 = uStack_1700;
        fVar27 = fVar27 * (float)local_15a8;
        fVar32 = fVar32 * local_15a8._4_4_;
        fVar33 = fVar33 * (float)uStack_15a0;
        fVar36 = fVar36 * uStack_15a0._4_4_;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_14e8 = local_1778;
        uStack_14e0 = uStack_1770;
        local_14f8 = 0x3c0889083c088908;
        uStack_14f0 = 0x3c0889083c088908;
        fVar27 = fVar27 + 0.008333452;
        fVar32 = fVar32 + 0.008333452;
        fVar33 = fVar33 + 0.008333452;
        fVar36 = fVar36 + 0.008333452;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1668 = local_1778;
        uStack_1660 = uStack_1770;
        local_1678 = local_1708;
        uStack_1670 = uStack_1700;
        fVar27 = fVar27 * (float)local_15a8;
        fVar32 = fVar32 * local_15a8._4_4_;
        fVar33 = fVar33 * (float)uStack_15a0;
        fVar36 = fVar36 * uStack_15a0._4_4_;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1508 = local_1778;
        uStack_1500 = uStack_1770;
        local_1518 = 0x3d2aa9c13d2aa9c1;
        uStack_1510 = 0x3d2aa9c13d2aa9c1;
        fVar27 = fVar27 + 0.041665796;
        fVar32 = fVar32 + 0.041665796;
        fVar33 = fVar33 + 0.041665796;
        fVar36 = fVar36 + 0.041665796;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1688 = local_1778;
        uStack_1680 = uStack_1770;
        local_1698 = local_1708;
        uStack_1690 = uStack_1700;
        fVar27 = fVar27 * (float)local_15a8;
        fVar32 = fVar32 * local_15a8._4_4_;
        fVar33 = fVar33 * (float)uStack_15a0;
        fVar36 = fVar36 * uStack_15a0._4_4_;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1528 = local_1778;
        uStack_1520 = uStack_1770;
        local_1538 = 0x3e2aaaaa3e2aaaaa;
        uStack_1530 = 0x3e2aaaaa3e2aaaaa;
        fVar27 = fVar27 + 0.16666666;
        fVar32 = fVar32 + 0.16666666;
        fVar33 = fVar33 + 0.16666666;
        fVar36 = fVar36 + 0.16666666;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_16a8 = local_1778;
        uStack_16a0 = uStack_1770;
        local_16b8 = local_1708;
        uStack_16b0 = uStack_1700;
        fVar27 = fVar27 * (float)local_15a8;
        fVar32 = fVar32 * local_15a8._4_4_;
        fVar33 = fVar33 * (float)uStack_15a0;
        fVar36 = fVar36 * uStack_15a0._4_4_;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1548 = local_1778;
        uStack_1540 = uStack_1770;
        fVar27 = fVar27 + 0.5;
        fVar32 = fVar32 + 0.5;
        fVar33 = fVar33 + 0.5;
        fVar36 = fVar36 + 0.5;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_16c8 = local_1778;
        uStack_16c0 = uStack_1770;
        local_16d8 = CONCAT44(fStack_1764,local_1768);
        uStack_16d0 = CONCAT44(fStack_175c,fStack_1760);
        fVar27 = fVar27 * local_1768;
        fVar32 = fVar32 * fStack_1764;
        fVar33 = fVar33 * fStack_1760;
        fVar36 = fVar36 * fStack_175c;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1568 = local_1778;
        uStack_1560 = uStack_1770;
        local_1578 = local_1708;
        uStack_1570 = uStack_1700;
        fVar27 = fVar27 + (float)local_15a8;
        fVar32 = fVar32 + local_15a8._4_4_;
        fVar33 = fVar33 + (float)uStack_15a0;
        fVar36 = fVar36 + uStack_15a0._4_4_;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1588 = local_1778;
        uStack_1580 = uStack_1770;
        local_1598 = 0x3f8000003f800000;
        uStack_1590 = 0x3f8000003f800000;
        fVar27 = fVar27 + 1.0;
        fVar32 = fVar32 + 1.0;
        fVar33 = fVar33 + 1.0;
        fVar36 = fVar36 + 1.0;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_1e8 = CONCAT44(fStack_1724,local_1728);
        uStack_1e0 = CONCAT44(fStack_171c,fStack_1720);
        local_d8 = CONCAT44((int)fStack_1724,(int)local_1728);
        uStack_d0 = CONCAT44((int)fStack_171c,(int)fStack_1720);
        local_388 = 0x7f0000007f;
        uStack_380 = 0x7f0000007f;
        iVar37 = (int)local_1728 + 0x7f;
        fStack_1734 = (float)((int)fStack_1724 + 0x7f);
        fStack_1730 = (float)((int)fStack_1720 + 0x7f);
        fStack_172c = (float)((int)fStack_171c + 0x7f);
        local_58 = CONCAT44(fStack_1734,iVar37);
        uStack_50 = CONCAT44(fStack_172c,fStack_1730);
        local_5c = 0x17;
        local_1738 = (float)(iVar37 * 0x800000);
        local_1788 = CONCAT44(fStack_1734,local_1738);
        uStack_1780 = CONCAT44(fStack_172c,fStack_1730);
        local_16e8 = local_1778;
        uStack_16e0 = uStack_1770;
        fVar27 = fVar27 * local_1738;
        fVar32 = fVar32 * fStack_1734;
        fVar33 = fVar33 * fStack_1730;
        fVar36 = fVar36 * fStack_172c;
        local_1778 = CONCAT44(fVar32,fVar27);
        uStack_1770 = CONCAT44(fVar36,fVar33);
        local_17b8 = local_1778;
        uStack_17b0 = uStack_1770;
        local_110c = 0x3f800000;
        local_1128 = 0x3f800000;
        local_17c8 = 0x3f8000003f800000;
        uStack_17c0 = 0x3f8000003f800000;
        fVar27 = fVar27 + 1.0;
        fVar32 = fVar32 + 1.0;
        fVar33 = fVar33 + 1.0;
        fVar36 = fVar36 + 1.0;
        local_1f28 = CONCAT44(fVar32,fVar27);
        uStack_1f20._0_4_ = fVar33;
        uStack_1f20._4_4_ = fVar36;
        local_698 = local_1f28;
        uStack_690 = uStack_1f20;
        local_6d8 = 0;
        uStack_6d0 = 0;
        local_6a8 = 0;
        uStack_6a0 = 0;
        local_1f58 = -(uint)(fVar27 <= 0.0);
        iStack_1f54 = -(uint)(fVar32 <= 0.0);
        iStack_1f50 = -(uint)(fVar33 <= 0.0);
        iStack_1f4c = -(uint)(fVar36 <= 0.0);
        local_5d8 = local_1f28;
        uStack_5d0 = uStack_1f20;
        local_5e8 = 0x80000000800000;
        uStack_5e0 = 0x80000000800000;
        auVar16._8_8_ = uStack_1f20;
        auVar16._0_8_ = local_1f28;
        auVar15._8_8_ = 0x80000000800000;
        auVar15._0_8_ = 0x80000000800000;
        auVar30 = maxps(auVar16,auVar15);
        local_1f28 = auVar30._0_8_;
        local_578 = local_1f28;
        uStack_1f20 = auVar30._8_8_;
        uStack_570 = uStack_1f20;
        uVar3 = local_1f28;
        uVar4 = uStack_1f20;
        local_59c = 0x17;
        local_598._0_4_ = auVar30._0_4_;
        local_598._4_4_ = auVar30._4_4_;
        uStack_590._0_4_ = auVar30._8_4_;
        uStack_590._4_4_ = auVar30._12_4_;
        local_438 = local_1f28;
        uStack_430 = uStack_1f20;
        local_448 = 0x807fffff807fffff;
        uStack_440 = 0x807fffff807fffff;
        local_3b8 = local_1f28 & 0x807fffff807fffff;
        uStack_3b0 = uStack_1f20 & 0x807fffff807fffff;
        local_f78 = local_3b8 | 0x3f0000003f000000;
        uStack_f70 = uStack_3b0 | 0x3f0000003f000000;
        local_378 = CONCAT44(local_598._4_4_ >> 0x17,(uint)local_598 >> 0x17);
        uStack_370 = CONCAT44(uStack_590._4_4_ >> 0x17,(uint)uStack_590 >> 0x17);
        local_1f38 = ((uint)local_598 >> 0x17) - 0x7f;
        iStack_1f34 = (local_598._4_4_ >> 0x17) - 0x7f;
        iStack_1f30 = ((uint)uStack_590 >> 0x17) - 0x7f;
        iStack_1f2c = (uStack_590._4_4_ >> 0x17) - 0x7f;
        local_318 = CONCAT44(iStack_1f34,local_1f38);
        uStack_310 = CONCAT44(iStack_1f2c,iStack_1f30);
        local_17d8 = CONCAT44((float)iStack_1f34,(float)local_1f38);
        uStack_17d0 = CONCAT44((float)iStack_1f2c,(float)iStack_1f30);
        local_17e8 = 0x3f8000003f800000;
        uStack_17e0 = 0x3f8000003f800000;
        local_1f68 = (float)local_1f38 + 1.0;
        fStack_1f64 = (float)iStack_1f34 + 1.0;
        fStack_1f60 = (float)iStack_1f30 + 1.0;
        fStack_1f5c = (float)iStack_1f2c + 1.0;
        local_2e8 = 0x3f3504f33f3504f3;
        uStack_2e0 = 0x3f3504f33f3504f3;
        local_2d8._0_4_ = (float)local_f78;
        local_2d8._4_4_ = (float)(local_f78 >> 0x20);
        uStack_2d0._0_4_ = (float)uStack_f70;
        uStack_2d0._4_4_ = (float)(uStack_f70 >> 0x20);
        local_1f78 = -(uint)((float)local_2d8 < 0.70710677);
        iStack_1f74 = -(uint)(local_2d8._4_4_ < 0.70710677);
        iStack_1f70 = -(uint)((float)uStack_2d0 < 0.70710677);
        iStack_1f6c = -(uint)(uStack_2d0._4_4_ < 0.70710677);
        local_468 = CONCAT44(iStack_1f74,local_1f78);
        uStack_460 = CONCAT44(iStack_1f6c,iStack_1f70);
        uVar28 = local_f78 & local_468;
        uVar34 = uStack_f70 & uStack_460;
        local_f88 = 0x3f8000003f800000;
        uStack_f80 = 0x3f8000003f800000;
        local_1f28 = CONCAT44(local_2d8._4_4_ - 1.0,(float)local_2d8 - 1.0);
        uStack_1f20._0_4_ = (float)uStack_2d0 - 1.0;
        uStack_1f20._4_4_ = uStack_2d0._4_4_ - 1.0;
        local_f98 = CONCAT44(fStack_1f64,local_1f68);
        uStack_f90 = CONCAT44(fStack_1f5c,fStack_1f60);
        local_478 = 0x3f8000003f800000;
        uStack_470 = 0x3f8000003f800000;
        local_488 = CONCAT44(iStack_1f74,local_1f78);
        uStack_480 = CONCAT44(iStack_1f6c,iStack_1f70);
        uVar29 = local_488 & 0x3f8000003f800000;
        uVar35 = uStack_480 & 0x3f8000003f800000;
        local_fa8._0_4_ = (float)uVar29;
        local_fa8._4_4_ = (float)(uVar29 >> 0x20);
        uStack_fa0._0_4_ = (float)uVar35;
        uStack_fa0._4_4_ = (float)(uVar35 >> 0x20);
        local_1f68 = local_1f68 - (float)local_fa8;
        fStack_1f64 = fStack_1f64 - local_fa8._4_4_;
        fStack_1f60 = fStack_1f60 - (float)uStack_fa0;
        fStack_1f5c = fStack_1f5c - uStack_fa0._4_4_;
        local_17f8 = local_1f28;
        uStack_17f0 = uStack_1f20;
        local_1808._0_4_ = (float)uVar28;
        local_1808._4_4_ = (float)(uVar28 >> 0x20);
        uStack_1800._0_4_ = (float)uVar34;
        uStack_1800._4_4_ = (float)(uVar34 >> 0x20);
        local_1808._0_4_ = ((float)local_2d8 - 1.0) + (float)local_1808;
        local_1808._4_4_ = (local_2d8._4_4_ - 1.0) + local_1808._4_4_;
        uStack_1800._0_4_ = ((float)uStack_2d0 - 1.0) + (float)uStack_1800;
        uStack_1800._4_4_ = (uStack_2d0._4_4_ - 1.0) + uStack_1800._4_4_;
        local_1f28 = CONCAT44(local_1808._4_4_,(float)local_1808);
        uStack_1f20._0_4_ = (float)uStack_1800;
        uStack_1f20._4_4_ = uStack_1800._4_4_;
        local_1d78 = local_1f28;
        uStack_1d70 = uStack_1f20;
        local_1f98 = (float)local_1808 * (float)local_1808;
        fStack_1f94 = local_1808._4_4_ * local_1808._4_4_;
        fStack_1f90 = (float)uStack_1800 * (float)uStack_1800;
        fStack_1f8c = uStack_1800._4_4_ * uStack_1800._4_4_;
        local_1d88 = 0x3d9021bb3d9021bb;
        uStack_1d80 = 0x3d9021bb3d9021bb;
        local_1d98 = local_1f28;
        uStack_1d90 = uStack_1f20;
        local_1fa8 = CONCAT44(local_1808._4_4_ * 0.070376836,(float)local_1808 * 0.070376836);
        uStack_1fa0 = CONCAT44(uStack_1800._4_4_ * 0.070376836,(float)uStack_1800 * 0.070376836);
        local_1818 = local_1fa8;
        uStack_1810 = uStack_1fa0;
        local_1828 = 0xbdebd1b8bdebd1b8;
        uStack_1820 = 0xbdebd1b8bdebd1b8;
        fVar27 = (float)local_1808 * 0.070376836 + -0.1151461;
        fVar32 = local_1808._4_4_ * 0.070376836 + -0.1151461;
        fVar33 = (float)uStack_1800 * 0.070376836 + -0.1151461;
        fVar36 = uStack_1800._4_4_ * 0.070376836 + -0.1151461;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1da8 = local_1fa8;
        uStack_1da0 = uStack_1fa0;
        local_1db8 = local_1f28;
        uStack_1db0 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1838 = local_1fa8;
        uStack_1830 = uStack_1fa0;
        local_1848 = 0x3def251a3def251a;
        uStack_1840 = 0x3def251a3def251a;
        fVar27 = fVar27 + 0.116769984;
        fVar32 = fVar32 + 0.116769984;
        fVar33 = fVar33 + 0.116769984;
        fVar36 = fVar36 + 0.116769984;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1dc8 = local_1fa8;
        uStack_1dc0 = uStack_1fa0;
        local_1dd8 = local_1f28;
        uStack_1dd0 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1858 = local_1fa8;
        uStack_1850 = uStack_1fa0;
        local_1868 = 0xbdfe5d4fbdfe5d4f;
        uStack_1860 = 0xbdfe5d4fbdfe5d4f;
        fVar27 = fVar27 + -0.12420141;
        fVar32 = fVar32 + -0.12420141;
        fVar33 = fVar33 + -0.12420141;
        fVar36 = fVar36 + -0.12420141;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1de8 = local_1fa8;
        uStack_1de0 = uStack_1fa0;
        local_1df8 = local_1f28;
        uStack_1df0 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1878 = local_1fa8;
        uStack_1870 = uStack_1fa0;
        local_1888 = 0x3e11e9bf3e11e9bf;
        uStack_1880 = 0x3e11e9bf3e11e9bf;
        fVar27 = fVar27 + 0.14249323;
        fVar32 = fVar32 + 0.14249323;
        fVar33 = fVar33 + 0.14249323;
        fVar36 = fVar36 + 0.14249323;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1e08 = local_1fa8;
        uStack_1e00 = uStack_1fa0;
        local_1e18 = local_1f28;
        uStack_1e10 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1898 = local_1fa8;
        uStack_1890 = uStack_1fa0;
        local_18a8 = 0xbe2aae50be2aae50;
        uStack_18a0 = 0xbe2aae50be2aae50;
        fVar27 = fVar27 + -0.16668057;
        fVar32 = fVar32 + -0.16668057;
        fVar33 = fVar33 + -0.16668057;
        fVar36 = fVar36 + -0.16668057;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1e28 = local_1fa8;
        uStack_1e20 = uStack_1fa0;
        local_1e38 = local_1f28;
        uStack_1e30 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_18b8 = local_1fa8;
        uStack_18b0 = uStack_1fa0;
        local_18c8 = 0x3e4cceac3e4cceac;
        uStack_18c0 = 0x3e4cceac3e4cceac;
        fVar27 = fVar27 + 0.20000714;
        fVar32 = fVar32 + 0.20000714;
        fVar33 = fVar33 + 0.20000714;
        fVar36 = fVar36 + 0.20000714;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1e48 = local_1fa8;
        uStack_1e40 = uStack_1fa0;
        local_1e58 = local_1f28;
        uStack_1e50 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_18d8 = local_1fa8;
        uStack_18d0 = uStack_1fa0;
        local_18e8 = 0xbe7ffffcbe7ffffc;
        uStack_18e0 = 0xbe7ffffcbe7ffffc;
        fVar27 = fVar27 + -0.24999994;
        fVar32 = fVar32 + -0.24999994;
        fVar33 = fVar33 + -0.24999994;
        fVar36 = fVar36 + -0.24999994;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1e68 = local_1fa8;
        uStack_1e60 = uStack_1fa0;
        local_1e78 = local_1f28;
        uStack_1e70 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_18f8 = local_1fa8;
        uStack_18f0 = uStack_1fa0;
        local_1908 = 0x3eaaaaaa3eaaaaaa;
        uStack_1900 = 0x3eaaaaaa3eaaaaaa;
        fVar27 = fVar27 + 0.3333333;
        fVar32 = fVar32 + 0.3333333;
        fVar33 = fVar33 + 0.3333333;
        fVar36 = fVar36 + 0.3333333;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1e88 = local_1fa8;
        uStack_1e80 = uStack_1fa0;
        local_1e98 = local_1f28;
        uStack_1e90 = uStack_1f20;
        fVar27 = fVar27 * (float)local_1808;
        fVar32 = fVar32 * local_1808._4_4_;
        fVar33 = fVar33 * (float)uStack_1800;
        fVar36 = fVar36 * uStack_1800._4_4_;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1ea8 = local_1fa8;
        uStack_1ea0 = uStack_1fa0;
        local_1eb8 = CONCAT44(fStack_1f94,local_1f98);
        uStack_1eb0 = CONCAT44(fStack_1f8c,fStack_1f90);
        fVar27 = fVar27 * local_1f98;
        fVar32 = fVar32 * fStack_1f94;
        fVar33 = fVar33 * fStack_1f90;
        fVar36 = fVar36 * fStack_1f8c;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1ec8 = CONCAT44(fStack_1f64,local_1f68);
        uStack_1ec0 = CONCAT44(fStack_1f5c,fStack_1f60);
        local_1f88 = CONCAT44(fStack_1f64 * -0.00021219444,local_1f68 * -0.00021219444);
        uStack_1f80 = CONCAT44(fStack_1f5c * -0.00021219444,fStack_1f60 * -0.00021219444);
        local_1918 = local_1fa8;
        uStack_1910 = uStack_1fa0;
        local_1928 = local_1f88;
        uStack_1920 = uStack_1f80;
        fVar27 = fVar27 + local_1f68 * -0.00021219444;
        fVar32 = fVar32 + fStack_1f64 * -0.00021219444;
        fVar33 = fVar33 + fStack_1f60 * -0.00021219444;
        fVar36 = fVar36 + fStack_1f5c * -0.00021219444;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1ee8 = CONCAT44(fStack_1f94,local_1f98);
        uStack_1ee0 = CONCAT44(fStack_1f8c,fStack_1f90);
        local_1f88 = CONCAT44(fStack_1f94 * 0.5,local_1f98 * 0.5);
        uStack_1f80 = CONCAT44(fStack_1f8c * 0.5,fStack_1f90 * 0.5);
        local_fb8 = local_1fa8;
        uStack_fb0 = uStack_1fa0;
        local_fc8 = local_1f88;
        uStack_fc0 = uStack_1f80;
        fVar27 = fVar27 - local_1f98 * 0.5;
        fVar32 = fVar32 - fStack_1f94 * 0.5;
        fVar33 = fVar33 - fStack_1f90 * 0.5;
        fVar36 = fVar36 - fStack_1f8c * 0.5;
        local_1fa8 = CONCAT44(fVar32,fVar27);
        uStack_1fa0 = CONCAT44(fVar36,fVar33);
        local_1f08 = CONCAT44(fStack_1f64,local_1f68);
        uStack_1f00 = CONCAT44(fStack_1f5c,fStack_1f60);
        local_1f88 = CONCAT44(fStack_1f64 * 0.6933594,local_1f68 * 0.6933594);
        uStack_1f80 = CONCAT44(fStack_1f5c * 0.6933594,fStack_1f60 * 0.6933594);
        local_1938 = local_1f28;
        uStack_1930 = uStack_1f20;
        local_1948 = local_1fa8;
        uStack_1940 = uStack_1fa0;
        local_1808._0_4_ = (float)local_1808 + fVar27;
        local_1808._4_4_ = local_1808._4_4_ + fVar32;
        uStack_1800._0_4_ = (float)uStack_1800 + fVar33;
        uStack_1800._4_4_ = uStack_1800._4_4_ + fVar36;
        local_1f28 = CONCAT44(local_1808._4_4_,(float)local_1808);
        uStack_1f20._0_4_ = (float)uStack_1800;
        uStack_1f20._4_4_ = uStack_1800._4_4_;
        local_1958 = local_1f28;
        uStack_1950 = uStack_1f20;
        local_1968 = local_1f88;
        uStack_1960 = uStack_1f80;
        local_1f28 = CONCAT44(local_1808._4_4_ + fStack_1f64 * 0.6933594,
                              (float)local_1808 + local_1f68 * 0.6933594);
        uStack_1f20._0_4_ = (float)uStack_1800 + fStack_1f60 * 0.6933594;
        uStack_1f20._4_4_ = uStack_1800._4_4_ + fStack_1f5c * 0.6933594;
        local_3d8 = local_1f28;
        uStack_3d0 = uStack_1f20;
        local_3e8 = CONCAT44(iStack_1f54,local_1f58);
        uStack_3e0 = CONCAT44(iStack_1f4c,iStack_1f50);
        local_2068 = local_1f28 | local_3e8;
        uStack_2060 = uStack_1f20 | uStack_3e0;
        uStack_1f20 = uStack_2060;
        local_1f28 = local_2068;
        local_112c = 0x3f800000;
        local_1148 = 0x3f800000;
        local_2078 = 0x3f8000003f800000;
        uStack_2070 = 0x3f8000003f800000;
        local_114c = 0x40000000;
        local_1168 = 0x40000000;
        local_2088 = 0x4000000040000000;
        uStack_2080 = 0x4000000040000000;
        local_2028._0_4_ = (float)local_2068;
        local_2028._4_4_ = (float)(local_2068 >> 0x20);
        uStack_2020._0_4_ = (float)uStack_2060;
        uStack_2020._4_4_ = (float)(uStack_2060 >> 0x20);
        local_b48 = (float)local_2028 * 2.0;
        fStack_b44 = local_2028._4_4_ * 2.0;
        fStack_b40 = (float)uStack_2020 * 2.0;
        fStack_b3c = uStack_2020._4_4_ * 2.0;
        local_80c = 0x3f800000;
        local_828 = 0x3f800000;
        local_b58 = 0x3f8000003f800000;
        uStack_b50 = 0x3f8000003f800000;
        local_738 = 0;
        uStack_730 = 0;
        local_798 = 0;
        uStack_790 = 0;
        local_7a8 = CONCAT44(fStack_b44,local_b48);
        uStack_7a0 = CONCAT44(fStack_b3c,fStack_b40);
        local_a98 = CONCAT44(0.0 - fStack_b44,0.0 - local_b48);
        uStack_a90._0_4_ = 0.0 - fStack_b40;
        uStack_a90._4_4_ = 0.0 - fStack_b3c;
        local_748 = 0;
        uStack_740 = 0;
        local_148 = 0x7f0000007f;
        uStack_140 = 0x7f0000007f;
        local_2b8 = local_a98;
        uStack_2b0 = uStack_a90;
        auVar18._8_8_ = uStack_a90;
        auVar18._0_8_ = local_a98;
        auVar17._8_8_ = 0x42b0c0a542b0c0a5;
        auVar17._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(auVar18,auVar17);
        local_a98 = auVar30._0_8_;
        local_678 = local_a98;
        uStack_a90 = auVar30._8_8_;
        uStack_670 = uStack_a90;
        auVar9._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar9._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar9);
        local_a98 = auVar30._0_8_;
        uVar5 = local_a98;
        uStack_a90 = auVar30._8_8_;
        uVar6 = uStack_a90;
        local_938._0_4_ = auVar30._0_4_;
        local_938._4_4_ = auVar30._4_4_;
        uStack_930._0_4_ = auVar30._8_4_;
        uStack_930._4_4_ = auVar30._12_4_;
        local_838 = CONCAT44(local_938._4_4_ * 1.442695,(float)local_938 * 1.442695);
        uStack_830 = CONCAT44(uStack_930._4_4_ * 1.442695,(float)uStack_930 * 1.442695);
        fVar27 = (float)local_938 * 1.442695 + 0.5;
        fVar32 = local_938._4_4_ * 1.442695 + 0.5;
        fVar33 = (float)uStack_930 * 1.442695 + 0.5;
        fVar36 = uStack_930._4_4_ * 1.442695 + 0.5;
        local_238 = CONCAT44(fVar32,fVar27);
        uStack_230 = CONCAT44(fVar36,fVar33);
        local_368 = CONCAT44((int)fVar32,(int)fVar27);
        uStack_360 = CONCAT44((int)fVar36,(int)fVar33);
        local_ab8 = (float)(int)fVar27;
        fStack_ab4 = (float)(int)fVar32;
        fStack_ab0 = (float)(int)fVar33;
        fStack_aac = (float)(int)fVar36;
        local_aa8 = CONCAT44(fStack_ab4,local_ab8);
        uStack_aa0 = CONCAT44(fStack_aac,fStack_ab0);
        local_1b8 = local_aa8;
        uStack_1b0 = uStack_aa0;
        local_1c8 = CONCAT44(fVar32,fVar27);
        uStack_1c0 = CONCAT44(fVar36,fVar33);
        local_ae8 = CONCAT44(-(uint)(fVar32 < fStack_ab4),-(uint)(fVar27 < local_ab8));
        uStack_ae0 = CONCAT44(-(uint)(fVar36 < fStack_aac),-(uint)(fVar33 < fStack_ab0));
        local_558 = local_ae8;
        uStack_550 = uStack_ae0;
        local_568 = 0x3f8000003f800000;
        uStack_560 = 0x3f8000003f800000;
        local_ae8 = local_ae8 & 0x3f8000003f800000;
        uStack_ae0 = uStack_ae0 & 0x3f8000003f800000;
        local_7b8 = local_aa8;
        uStack_7b0 = uStack_aa0;
        local_7c8._0_4_ = (float)local_ae8;
        local_7c8._4_4_ = (float)(local_ae8 >> 0x20);
        uStack_7c0._0_4_ = (float)uStack_ae0;
        uStack_7c0._4_4_ = (float)(uStack_ae0 >> 0x20);
        local_ab8 = local_ab8 - (float)local_7c8;
        fStack_ab4 = fStack_ab4 - local_7c8._4_4_;
        fStack_ab0 = fStack_ab0 - (float)uStack_7c0;
        fStack_aac = fStack_aac - uStack_7c0._4_4_;
        local_958 = CONCAT44(fStack_ab4,local_ab8);
        uStack_950 = CONCAT44(fStack_aac,fStack_ab0);
        local_aa8 = CONCAT44(fStack_ab4 * 0.6933594,local_ab8 * 0.6933594);
        uStack_aa0 = CONCAT44(fStack_aac * 0.6933594,fStack_ab0 * 0.6933594);
        local_978 = CONCAT44(fStack_ab4,local_ab8);
        uStack_970 = CONCAT44(fStack_aac,fStack_ab0);
        local_7d8 = local_a98;
        uStack_7d0 = uStack_a90;
        local_7e8 = local_aa8;
        uStack_7e0 = uStack_aa0;
        local_938._0_4_ = (float)local_938 - local_ab8 * 0.6933594;
        local_938._4_4_ = local_938._4_4_ - fStack_ab4 * 0.6933594;
        uStack_930._0_4_ = (float)uStack_930 - fStack_ab0 * 0.6933594;
        uStack_930._4_4_ = uStack_930._4_4_ - fStack_aac * 0.6933594;
        local_a98 = CONCAT44(local_938._4_4_,(float)local_938);
        uStack_a90._0_4_ = (float)uStack_930;
        uStack_a90._4_4_ = uStack_930._4_4_;
        local_7f8 = local_a98;
        uStack_7f0 = uStack_a90;
        local_808 = CONCAT44(fStack_ab4 * -0.00021219444,local_ab8 * -0.00021219444);
        uStack_800 = CONCAT44(fStack_aac * -0.00021219444,fStack_ab0 * -0.00021219444);
        local_938._0_4_ = (float)local_938 - local_ab8 * -0.00021219444;
        local_938._4_4_ = local_938._4_4_ - fStack_ab4 * -0.00021219444;
        uStack_930._0_4_ = (float)uStack_930 - fStack_ab0 * -0.00021219444;
        uStack_930._4_4_ = uStack_930._4_4_ - fStack_aac * -0.00021219444;
        local_a98 = CONCAT44(local_938._4_4_,(float)local_938);
        uStack_a90._0_4_ = (float)uStack_930;
        uStack_a90._4_4_ = uStack_930._4_4_;
        local_9a8 = local_a98;
        uStack_9a0 = uStack_a90;
        local_af8 = (float)local_938 * (float)local_938;
        fStack_af4 = local_938._4_4_ * local_938._4_4_;
        fStack_af0 = (float)uStack_930 * (float)uStack_930;
        fStack_aec = uStack_930._4_4_ * uStack_930._4_4_;
        local_9b8 = 0x3950696739506967;
        uStack_9b0 = 0x3950696739506967;
        local_9c8 = local_a98;
        uStack_9c0 = uStack_a90;
        local_b08 = CONCAT44(local_938._4_4_ * 0.00019875691,(float)local_938 * 0.00019875691);
        uStack_b00 = CONCAT44(uStack_930._4_4_ * 0.00019875691,(float)uStack_930 * 0.00019875691);
        local_858 = local_b08;
        uStack_850 = uStack_b00;
        local_788 = (float)local_938 * 0.00019875691 + 0.0013981999;
        fStack_784 = local_938._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_780 = (float)uStack_930 * 0.00019875691 + 0.0013981999;
        fStack_77c = uStack_930._4_4_ * 0.00019875691 + 0.0013981999;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_9d8 = local_b08;
        uStack_9d0 = uStack_b00;
        local_9e8 = local_a98;
        uStack_9e0 = uStack_a90;
        local_788 = local_788 * (float)local_938;
        fStack_784 = fStack_784 * local_938._4_4_;
        fStack_780 = fStack_780 * (float)uStack_930;
        fStack_77c = fStack_77c * uStack_930._4_4_;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_878 = local_b08;
        uStack_870 = uStack_b00;
        local_788 = local_788 + 0.008333452;
        fStack_784 = fStack_784 + 0.008333452;
        fStack_780 = fStack_780 + 0.008333452;
        fStack_77c = fStack_77c + 0.008333452;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_9f8 = local_b08;
        uStack_9f0 = uStack_b00;
        local_a08 = local_a98;
        uStack_a00 = uStack_a90;
        local_788 = local_788 * (float)local_938;
        fStack_784 = fStack_784 * local_938._4_4_;
        fStack_780 = fStack_780 * (float)uStack_930;
        fStack_77c = fStack_77c * uStack_930._4_4_;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_898 = local_b08;
        uStack_890 = uStack_b00;
        local_788 = local_788 + 0.041665796;
        fStack_784 = fStack_784 + 0.041665796;
        fStack_780 = fStack_780 + 0.041665796;
        fStack_77c = fStack_77c + 0.041665796;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_a18 = local_b08;
        uStack_a10 = uStack_b00;
        local_a28 = local_a98;
        uStack_a20 = uStack_a90;
        local_788 = local_788 * (float)local_938;
        fStack_784 = fStack_784 * local_938._4_4_;
        fStack_780 = fStack_780 * (float)uStack_930;
        fStack_77c = fStack_77c * uStack_930._4_4_;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_8b8 = local_b08;
        uStack_8b0 = uStack_b00;
        local_788 = local_788 + 0.16666666;
        fStack_784 = fStack_784 + 0.16666666;
        fStack_780 = fStack_780 + 0.16666666;
        fStack_77c = fStack_77c + 0.16666666;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_a38 = local_b08;
        uStack_a30 = uStack_b00;
        local_a48 = local_a98;
        uStack_a40 = uStack_a90;
        local_788 = local_788 * (float)local_938;
        fStack_784 = fStack_784 * local_938._4_4_;
        fStack_780 = fStack_780 * (float)uStack_930;
        fStack_77c = fStack_77c * uStack_930._4_4_;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_8d8 = local_b08;
        uStack_8d0 = uStack_b00;
        local_788 = local_788 + 0.5;
        fStack_784 = fStack_784 + 0.5;
        fStack_780 = fStack_780 + 0.5;
        fStack_77c = fStack_77c + 0.5;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_a58 = local_b08;
        uStack_a50 = uStack_b00;
        local_a68 = CONCAT44(fStack_af4,local_af8);
        uStack_a60 = CONCAT44(fStack_aec,fStack_af0);
        local_788 = local_788 * local_af8;
        fStack_784 = fStack_784 * fStack_af4;
        fStack_780 = fStack_780 * fStack_af0;
        fStack_77c = fStack_77c * fStack_aec;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_8f8 = local_b08;
        uStack_8f0 = uStack_b00;
        local_908 = local_a98;
        uStack_900 = uStack_a90;
        local_788 = local_788 + (float)local_938;
        fStack_784 = fStack_784 + local_938._4_4_;
        fStack_780 = fStack_780 + (float)uStack_930;
        fStack_77c = fStack_77c + uStack_930._4_4_;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_918 = local_b08;
        uStack_910 = uStack_b00;
        local_928 = 0x3f8000003f800000;
        uStack_920 = 0x3f8000003f800000;
        local_788 = local_788 + 1.0;
        fStack_784 = fStack_784 + 1.0;
        fStack_780 = fStack_780 + 1.0;
        fStack_77c = fStack_77c + 1.0;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_248 = CONCAT44(fStack_ab4,local_ab8);
        uStack_240 = CONCAT44(fStack_aac,fStack_ab0);
        local_138 = CONCAT44((int)fStack_ab4,(int)local_ab8);
        uStack_130 = CONCAT44((int)fStack_aac,(int)fStack_ab0);
        iVar37 = (int)local_ab8 + 0x7f;
        fStack_ac4 = (float)((int)fStack_ab4 + 0x7f);
        fStack_ac0 = (float)((int)fStack_ab0 + 0x7f);
        fStack_abc = (float)((int)fStack_aac + 0x7f);
        local_b8 = CONCAT44(fStack_ac4,iVar37);
        uStack_b0 = CONCAT44(fStack_abc,fStack_ac0);
        local_bc = 0x17;
        local_ac8 = (float)(iVar37 * 0x800000);
        local_b18 = CONCAT44(fStack_ac4,local_ac8);
        uStack_b10 = CONCAT44(fStack_abc,fStack_ac0);
        local_a78 = local_b08;
        uStack_a70 = uStack_b00;
        local_788 = local_788 * local_ac8;
        fStack_784 = fStack_784 * fStack_ac4;
        fStack_780 = fStack_780 * fStack_ac0;
        fStack_77c = fStack_77c * fStack_abc;
        local_b08 = CONCAT44(fStack_784,local_788);
        uStack_b00 = CONCAT44(fStack_77c,fStack_780);
        local_b38 = local_b08;
        uStack_b30 = uStack_b00;
        local_788 = local_788 + 1.0;
        fStack_784 = fStack_784 + 1.0;
        fStack_780 = fStack_780 + 1.0;
        fStack_77c = fStack_77c + 1.0;
        auVar8._8_8_ = 0x3f8000003f800000;
        auVar8._0_8_ = 0x3f8000003f800000;
        auVar7._4_4_ = fStack_784;
        auVar7._0_4_ = local_788;
        auVar7._8_4_ = fStack_780;
        auVar7._12_4_ = fStack_77c;
        _local_2048 = divps(auVar8,auVar7);
        local_f38 = (float)local_2048._0_4_ * 2.0;
        fStack_f34 = (float)local_2048._4_4_ * 2.0;
        fStack_f30 = fStack_2040 * 2.0;
        fStack_f2c = fStack_203c * 2.0;
        local_20c8 = local_f38 - 1.0;
        fStack_20c4 = fStack_f34 - 1.0;
        fStack_20c0 = fStack_f30 - 1.0;
        fStack_20bc = fStack_f2c - 1.0;
        local_20b8._0_4_ = (undefined4)local_2118;
        local_20b8._4_4_ = (undefined4)((ulong)local_2118 >> 0x20);
        fStack_20b0 = (float)uStack_2110;
        fStack_20ac = (float)((ulong)uStack_2110 >> 0x20);
        local_21e8 = CONCAT44((float)local_20b8._4_4_ * fStack_20c4,
                              (float)local_20b8._0_4_ * local_20c8);
        uStack_21e0 = CONCAT44(fStack_20ac * fStack_20bc,fStack_20b0 * fStack_20c0);
        local_20d0 = local_2178;
        local_20e8 = local_21e8;
        uStack_20e0 = uStack_21e0;
        *(undefined8 *)*local_2178 = local_21e8;
        *(undefined8 *)(*local_2178 + 8) = uStack_21e0;
        local_2178 = local_2178 + 1;
        _local_20b8 = auVar31;
        local_2058 = local_2088;
        uStack_2050 = uStack_2080;
        local_2038 = local_2088;
        uStack_2030 = uStack_2080;
        local_2028 = local_2068;
        uStack_2020 = uStack_2060;
        local_1d68 = local_1d78;
        uStack_1d60 = uStack_1d70;
        local_1808 = uVar28;
        uStack_1800 = uVar34;
        local_1748 = local_1f48;
        uStack_1740 = uStack_1f40;
        local_16f8 = local_1788;
        uStack_16f0 = uStack_1780;
        local_1608 = local_1618;
        uStack_1600 = uStack_1610;
        local_15f8 = local_1ed8;
        uStack_15f0 = uStack_1ed0;
        local_15d8 = local_1f18;
        uStack_15d0 = uStack_1f10;
        local_15a8 = uVar1;
        uStack_15a0 = uVar2;
        local_1558 = local_1ef8;
        uStack_1550 = uStack_1ef0;
        local_14b8 = local_1ef8;
        uStack_14b0 = uStack_1ef0;
        uStack_1164 = local_1168;
        uStack_1160 = local_1168;
        uStack_115c = local_1168;
        uStack_1144 = local_1148;
        uStack_1140 = local_1148;
        uStack_113c = local_1148;
        uStack_1124 = local_1128;
        uStack_1120 = local_1128;
        uStack_111c = local_1128;
        local_1048 = local_1758;
        uStack_1040 = uStack_1750;
        local_fa8 = uVar29;
        uStack_fa0 = uVar35;
        local_f48 = local_2078;
        uStack_f40 = uStack_2070;
        local_b28 = local_b58;
        uStack_b20 = uStack_b50;
        local_ad8 = local_1f48;
        uStack_ad0 = uStack_1f40;
        local_a88 = local_b18;
        uStack_a80 = uStack_b10;
        local_998 = local_9a8;
        uStack_990 = uStack_9a0;
        local_988 = local_1ed8;
        uStack_980 = uStack_1ed0;
        local_968 = local_1f18;
        uStack_960 = uStack_1f10;
        local_948 = local_15b8;
        uStack_940 = uStack_15b0;
        local_938 = uVar5;
        uStack_930 = uVar6;
        local_8e8 = local_1ef8;
        uStack_8e0 = uStack_1ef0;
        local_8c8 = local_1538;
        uStack_8c0 = uStack_1530;
        local_8a8 = local_1518;
        uStack_8a0 = uStack_1510;
        local_888 = local_14f8;
        uStack_880 = uStack_14f0;
        local_868 = local_14d8;
        uStack_860 = uStack_14d0;
        local_848 = local_1ef8;
        uStack_840 = uStack_1ef0;
        uStack_824 = local_828;
        uStack_820 = local_828;
        uStack_81c = local_828;
        local_7c8 = local_ae8;
        uStack_7c0 = uStack_ae0;
        local_778 = local_b58;
        uStack_770 = uStack_b50;
        local_628 = local_688;
        uStack_620 = uStack_680;
        local_598 = uVar3;
        uStack_590 = uVar4;
        local_458 = local_f78;
        uStack_450 = uStack_f70;
        local_3c8 = local_1ef8;
        uStack_3c0 = uStack_1ef0;
        local_2d8 = local_f78;
        uStack_2d0 = uStack_f70;
        local_268 = local_2c8;
        uStack_260 = uStack_2c0;
        local_258 = local_2118;
        uStack_250 = uStack_2110;
        local_e8 = local_388;
        uStack_e0 = uStack_380;
        local_48 = local_b18;
        uStack_40 = uStack_b10;
        local_18 = local_1788;
        uStack_10 = uStack_1780;
      }
    }
  }
  else {
    for (local_21ec = 0; local_21ec < local_2164; local_21ec = local_21ec + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdd48,(int)((ulong)in_stack_ffffffffffffdd40 >> 0x20));
      pauVar23 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_2240);
      ncnn::Mat::~Mat((Mat *)0x8ecc87);
      local_21f8 = pauVar23;
      for (local_2244 = 0; local_2244 + 3 < local_2168; local_2244 = local_2244 + 4) {
        local_2138 = local_21f8;
        local_2128 = *(undefined8 *)*local_21f8;
        uStack_2120 = *(undefined8 *)(*local_21f8 + 8);
        auVar25 = *local_21f8;
        in_stack_ffffffffffffdd40 = 0;
        local_708 = 0;
        uStack_700 = 0;
        local_1cf8 = 0x3f8000003f800000;
        uStack_1cf0 = 0x3f8000003f800000;
        local_2a8 = 0x42b0c0a542b0c0a5;
        uStack_2a0 = 0x42b0c0a542b0c0a5;
        auVar21._8_8_ = 0x42b0c0a542b0c0a5;
        auVar21._0_8_ = 0x42b0c0a542b0c0a5;
        auVar31 = minps(*local_21f8,auVar21);
        local_1418 = auVar31._0_8_;
        local_638 = local_1418;
        uStack_1410 = auVar31._8_8_;
        uStack_630 = uStack_1410;
        local_668 = 0xc2b0c0a5c2b0c0a5;
        uStack_660 = 0xc2b0c0a5c2b0c0a5;
        auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar31 = maxps(auVar31,auVar11);
        local_1418 = auVar31._0_8_;
        uVar1 = local_1418;
        uStack_1410 = auVar31._8_8_;
        uVar2 = uStack_1410;
        local_12c8 = 0x3fb8aa3b3fb8aa3b;
        uStack_12c0 = 0x3fb8aa3b3fb8aa3b;
        local_12b8._0_4_ = auVar31._0_4_;
        local_12b8._4_4_ = auVar31._4_4_;
        uStack_12b0._0_4_ = auVar31._8_4_;
        uStack_12b0._4_4_ = auVar31._12_4_;
        local_11b8 = CONCAT44(local_12b8._4_4_ * 1.442695,(float)local_12b8 * 1.442695);
        uStack_11b0 = CONCAT44(uStack_12b0._4_4_ * 1.442695,(float)uStack_12b0 * 1.442695);
        local_1ca8 = 0x3f0000003f000000;
        uStack_1ca0 = 0x3f0000003f000000;
        fVar27 = (float)local_12b8 * 1.442695 + 0.5;
        fVar32 = local_12b8._4_4_ * 1.442695 + 0.5;
        fVar33 = (float)uStack_12b0 * 1.442695 + 0.5;
        fVar36 = uStack_12b0._4_4_ * 1.442695 + 0.5;
        local_1f8 = CONCAT44(fVar32,fVar27);
        uStack_1f0 = CONCAT44(fVar36,fVar33);
        local_348 = CONCAT44((int)fVar32,(int)fVar27);
        uStack_340 = CONCAT44((int)fVar36,(int)fVar33);
        local_1438 = (float)(int)fVar27;
        fStack_1434 = (float)(int)fVar32;
        fStack_1430 = (float)(int)fVar33;
        fStack_142c = (float)(int)fVar36;
        local_1428 = CONCAT44(fStack_1434,local_1438);
        uStack_1420 = CONCAT44(fStack_142c,fStack_1430);
        local_178 = local_1428;
        uStack_170 = uStack_1420;
        local_188 = CONCAT44(fVar32,fVar27);
        uStack_180 = CONCAT44(fVar36,fVar33);
        local_1468 = CONCAT44(-(uint)(fVar32 < fStack_1434),-(uint)(fVar27 < local_1438));
        uStack_1460 = CONCAT44(-(uint)(fVar36 < fStack_142c),-(uint)(fVar33 < fStack_1430));
        local_518 = local_1468;
        uStack_510 = uStack_1460;
        local_528 = 0x3f8000003f800000;
        uStack_520 = 0x3f8000003f800000;
        local_1468 = local_1468 & 0x3f8000003f800000;
        uStack_1460 = uStack_1460 & 0x3f8000003f800000;
        local_1098 = local_1428;
        uStack_1090 = uStack_1420;
        local_10a8._0_4_ = (float)local_1468;
        local_10a8._4_4_ = (float)(local_1468 >> 0x20);
        uStack_10a0._0_4_ = (float)uStack_1460;
        uStack_10a0._4_4_ = (float)(uStack_1460 >> 0x20);
        local_1438 = local_1438 - (float)local_10a8;
        fStack_1434 = fStack_1434 - local_10a8._4_4_;
        fStack_1430 = fStack_1430 - (float)uStack_10a0;
        fStack_142c = fStack_142c - uStack_10a0._4_4_;
        local_12d8 = CONCAT44(fStack_1434,local_1438);
        uStack_12d0 = CONCAT44(fStack_142c,fStack_1430);
        local_1cc8 = 0x3f3180003f318000;
        uStack_1cc0 = 0x3f3180003f318000;
        local_1428 = CONCAT44(fStack_1434 * 0.6933594,local_1438 * 0.6933594);
        uStack_1420 = CONCAT44(fStack_142c * 0.6933594,fStack_1430 * 0.6933594);
        local_12f8 = CONCAT44(fStack_1434,local_1438);
        uStack_12f0 = CONCAT44(fStack_142c,fStack_1430);
        local_1c88 = 0xb95e8083b95e8083;
        uStack_1c80 = 0xb95e8083b95e8083;
        local_10b8 = local_1418;
        uStack_10b0 = uStack_1410;
        local_10c8 = local_1428;
        uStack_10c0 = uStack_1420;
        local_12b8._0_4_ = (float)local_12b8 - local_1438 * 0.6933594;
        local_12b8._4_4_ = local_12b8._4_4_ - fStack_1434 * 0.6933594;
        uStack_12b0._0_4_ = (float)uStack_12b0 - fStack_1430 * 0.6933594;
        uStack_12b0._4_4_ = uStack_12b0._4_4_ - fStack_142c * 0.6933594;
        local_1418 = CONCAT44(local_12b8._4_4_,(float)local_12b8);
        uStack_1410._0_4_ = (float)uStack_12b0;
        uStack_1410._4_4_ = uStack_12b0._4_4_;
        local_10d8 = local_1418;
        uStack_10d0 = uStack_1410;
        local_10e8 = CONCAT44(fStack_1434 * -0.00021219444,local_1438 * -0.00021219444);
        uStack_10e0 = CONCAT44(fStack_142c * -0.00021219444,fStack_1430 * -0.00021219444);
        local_12b8._0_4_ = (float)local_12b8 - local_1438 * -0.00021219444;
        local_12b8._4_4_ = local_12b8._4_4_ - fStack_1434 * -0.00021219444;
        uStack_12b0._0_4_ = (float)uStack_12b0 - fStack_1430 * -0.00021219444;
        uStack_12b0._4_4_ = uStack_12b0._4_4_ - fStack_142c * -0.00021219444;
        local_1418 = CONCAT44(local_12b8._4_4_,(float)local_12b8);
        uStack_1410._0_4_ = (float)uStack_12b0;
        uStack_1410._4_4_ = uStack_12b0._4_4_;
        local_1328 = local_1418;
        uStack_1320 = uStack_1410;
        local_1478 = (float)local_12b8 * (float)local_12b8;
        fStack_1474 = local_12b8._4_4_ * local_12b8._4_4_;
        fStack_1470 = (float)uStack_12b0 * (float)uStack_12b0;
        fStack_146c = uStack_12b0._4_4_ * uStack_12b0._4_4_;
        local_1338 = 0x3950696739506967;
        uStack_1330 = 0x3950696739506967;
        local_1348 = local_1418;
        uStack_1340 = uStack_1410;
        local_1488 = CONCAT44(local_12b8._4_4_ * 0.00019875691,(float)local_12b8 * 0.00019875691);
        uStack_1480 = CONCAT44(uStack_12b0._4_4_ * 0.00019875691,(float)uStack_12b0 * 0.00019875691)
        ;
        local_11d8 = local_1488;
        uStack_11d0 = uStack_1480;
        local_11e8 = 0x3ab743ce3ab743ce;
        uStack_11e0 = 0x3ab743ce3ab743ce;
        fVar27 = (float)local_12b8 * 0.00019875691 + 0.0013981999;
        fVar32 = local_12b8._4_4_ * 0.00019875691 + 0.0013981999;
        fVar33 = (float)uStack_12b0 * 0.00019875691 + 0.0013981999;
        fVar36 = uStack_12b0._4_4_ * 0.00019875691 + 0.0013981999;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1358 = local_1488;
        uStack_1350 = uStack_1480;
        local_1368 = local_1418;
        uStack_1360 = uStack_1410;
        fVar27 = fVar27 * (float)local_12b8;
        fVar32 = fVar32 * local_12b8._4_4_;
        fVar33 = fVar33 * (float)uStack_12b0;
        fVar36 = fVar36 * uStack_12b0._4_4_;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_11f8 = local_1488;
        uStack_11f0 = uStack_1480;
        local_1208 = 0x3c0889083c088908;
        uStack_1200 = 0x3c0889083c088908;
        fVar27 = fVar27 + 0.008333452;
        fVar32 = fVar32 + 0.008333452;
        fVar33 = fVar33 + 0.008333452;
        fVar36 = fVar36 + 0.008333452;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1378 = local_1488;
        uStack_1370 = uStack_1480;
        local_1388 = local_1418;
        uStack_1380 = uStack_1410;
        fVar27 = fVar27 * (float)local_12b8;
        fVar32 = fVar32 * local_12b8._4_4_;
        fVar33 = fVar33 * (float)uStack_12b0;
        fVar36 = fVar36 * uStack_12b0._4_4_;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1218 = local_1488;
        uStack_1210 = uStack_1480;
        local_1228 = 0x3d2aa9c13d2aa9c1;
        uStack_1220 = 0x3d2aa9c13d2aa9c1;
        fVar27 = fVar27 + 0.041665796;
        fVar32 = fVar32 + 0.041665796;
        fVar33 = fVar33 + 0.041665796;
        fVar36 = fVar36 + 0.041665796;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1398 = local_1488;
        uStack_1390 = uStack_1480;
        local_13a8 = local_1418;
        uStack_13a0 = uStack_1410;
        fVar27 = fVar27 * (float)local_12b8;
        fVar32 = fVar32 * local_12b8._4_4_;
        fVar33 = fVar33 * (float)uStack_12b0;
        fVar36 = fVar36 * uStack_12b0._4_4_;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1238 = local_1488;
        uStack_1230 = uStack_1480;
        local_1248 = 0x3e2aaaaa3e2aaaaa;
        uStack_1240 = 0x3e2aaaaa3e2aaaaa;
        fVar27 = fVar27 + 0.16666666;
        fVar32 = fVar32 + 0.16666666;
        fVar33 = fVar33 + 0.16666666;
        fVar36 = fVar36 + 0.16666666;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_13b8 = local_1488;
        uStack_13b0 = uStack_1480;
        local_13c8 = local_1418;
        uStack_13c0 = uStack_1410;
        fVar27 = fVar27 * (float)local_12b8;
        fVar32 = fVar32 * local_12b8._4_4_;
        fVar33 = fVar33 * (float)uStack_12b0;
        fVar36 = fVar36 * uStack_12b0._4_4_;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1258 = local_1488;
        uStack_1250 = uStack_1480;
        fVar27 = fVar27 + 0.5;
        fVar32 = fVar32 + 0.5;
        fVar33 = fVar33 + 0.5;
        fVar36 = fVar36 + 0.5;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_13d8 = local_1488;
        uStack_13d0 = uStack_1480;
        local_13e8 = CONCAT44(fStack_1474,local_1478);
        uStack_13e0 = CONCAT44(fStack_146c,fStack_1470);
        fVar27 = fVar27 * local_1478;
        fVar32 = fVar32 * fStack_1474;
        fVar33 = fVar33 * fStack_1470;
        fVar36 = fVar36 * fStack_146c;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1278 = local_1488;
        uStack_1270 = uStack_1480;
        local_1288 = local_1418;
        uStack_1280 = uStack_1410;
        fVar27 = fVar27 + (float)local_12b8;
        fVar32 = fVar32 + local_12b8._4_4_;
        fVar33 = fVar33 + (float)uStack_12b0;
        fVar36 = fVar36 + uStack_12b0._4_4_;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1298 = local_1488;
        uStack_1290 = uStack_1480;
        local_12a8 = 0x3f8000003f800000;
        uStack_12a0 = 0x3f8000003f800000;
        fVar27 = fVar27 + 1.0;
        fVar32 = fVar32 + 1.0;
        fVar33 = fVar33 + 1.0;
        fVar36 = fVar36 + 1.0;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_208 = CONCAT44(fStack_1434,local_1438);
        uStack_200 = CONCAT44(fStack_142c,fStack_1430);
        local_f8 = CONCAT44((int)fStack_1434,(int)local_1438);
        uStack_f0 = CONCAT44((int)fStack_142c,(int)fStack_1430);
        in_stack_ffffffffffffdd48 = (Mat *)0x7f0000007f;
        uStack_3a0 = 0x7f0000007f;
        iVar37 = (int)local_1438 + 0x7f;
        fStack_1444 = (float)((int)fStack_1434 + 0x7f);
        fStack_1440 = (float)((int)fStack_1430 + 0x7f);
        fStack_143c = (float)((int)fStack_142c + 0x7f);
        local_78 = CONCAT44(fStack_1444,iVar37);
        uStack_70 = CONCAT44(fStack_143c,fStack_1440);
        local_7c = 0x17;
        local_1448 = (float)(iVar37 * 0x800000);
        local_1498 = CONCAT44(fStack_1444,local_1448);
        uStack_1490 = CONCAT44(fStack_143c,fStack_1440);
        local_13f8 = local_1488;
        uStack_13f0 = uStack_1480;
        fVar27 = fVar27 * local_1448;
        fVar32 = fVar32 * fStack_1444;
        fVar33 = fVar33 * fStack_1440;
        fVar36 = fVar36 * fStack_143c;
        local_1488 = CONCAT44(fVar32,fVar27);
        uStack_1480 = CONCAT44(fVar36,fVar33);
        local_1798 = local_1488;
        uStack_1790 = uStack_1480;
        local_10ec = 0x3f800000;
        local_1108 = 0x3f800000;
        local_17a8 = 0x3f8000003f800000;
        uStack_17a0 = 0x3f8000003f800000;
        fVar27 = fVar27 + 1.0;
        fVar32 = fVar32 + 1.0;
        fVar33 = fVar33 + 1.0;
        fVar36 = fVar36 + 1.0;
        local_1cd8 = CONCAT44(fVar32,fVar27);
        uStack_1cd0._0_4_ = fVar33;
        uStack_1cd0._4_4_ = fVar36;
        local_6b8 = local_1cd8;
        uStack_6b0 = uStack_1cd0;
        local_6e8 = 0;
        uStack_6e0 = 0;
        local_6c8 = 0;
        uStack_6c0 = 0;
        local_1d08 = -(uint)(fVar27 <= 0.0);
        iStack_1d04 = -(uint)(fVar32 <= 0.0);
        iStack_1d00 = -(uint)(fVar33 <= 0.0);
        iStack_1cfc = -(uint)(fVar36 <= 0.0);
        local_5f8 = local_1cd8;
        uStack_5f0 = uStack_1cd0;
        local_608 = 0x80000000800000;
        uStack_600 = 0x80000000800000;
        auVar14._8_8_ = uStack_1cd0;
        auVar14._0_8_ = local_1cd8;
        auVar13._8_8_ = 0x80000000800000;
        auVar13._0_8_ = 0x80000000800000;
        auVar31 = maxps(auVar14,auVar13);
        local_1cd8 = auVar31._0_8_;
        local_588 = local_1cd8;
        uStack_1cd0 = auVar31._8_8_;
        uStack_580 = uStack_1cd0;
        uVar3 = local_1cd8;
        uVar4 = uStack_1cd0;
        local_5bc = 0x17;
        local_5b8._0_4_ = auVar31._0_4_;
        local_5b8._4_4_ = auVar31._4_4_;
        uStack_5b0._0_4_ = auVar31._8_4_;
        uStack_5b0._4_4_ = auVar31._12_4_;
        local_498 = local_1cd8;
        uStack_490 = uStack_1cd0;
        local_4a8 = 0x807fffff807fffff;
        uStack_4a0 = 0x807fffff807fffff;
        local_3f8 = local_1cd8 & 0x807fffff807fffff;
        uStack_3f0 = uStack_1cd0 & 0x807fffff807fffff;
        local_fd8 = local_3f8 | 0x3f0000003f000000;
        uStack_fd0 = uStack_3f0 | 0x3f0000003f000000;
        local_398 = CONCAT44(local_5b8._4_4_ >> 0x17,(uint)local_5b8 >> 0x17);
        uStack_390 = CONCAT44(uStack_5b0._4_4_ >> 0x17,(uint)uStack_5b0 >> 0x17);
        local_1ce8 = ((uint)local_5b8 >> 0x17) - 0x7f;
        iStack_1ce4 = (local_5b8._4_4_ >> 0x17) - 0x7f;
        iStack_1ce0 = ((uint)uStack_5b0 >> 0x17) - 0x7f;
        iStack_1cdc = (uStack_5b0._4_4_ >> 0x17) - 0x7f;
        local_328 = CONCAT44(iStack_1ce4,local_1ce8);
        uStack_320 = CONCAT44(iStack_1cdc,iStack_1ce0);
        local_1978 = CONCAT44((float)iStack_1ce4,(float)local_1ce8);
        uStack_1970 = CONCAT44((float)iStack_1cdc,(float)iStack_1ce0);
        local_1988 = 0x3f8000003f800000;
        uStack_1980 = 0x3f8000003f800000;
        local_1d18 = (float)local_1ce8 + 1.0;
        fStack_1d14 = (float)iStack_1ce4 + 1.0;
        fStack_1d10 = (float)iStack_1ce0 + 1.0;
        fStack_1d0c = (float)iStack_1cdc + 1.0;
        local_308 = 0x3f3504f33f3504f3;
        uStack_300 = 0x3f3504f33f3504f3;
        local_2f8._0_4_ = (float)local_fd8;
        local_2f8._4_4_ = (float)(local_fd8 >> 0x20);
        uStack_2f0._0_4_ = (float)uStack_fd0;
        uStack_2f0._4_4_ = (float)(uStack_fd0 >> 0x20);
        local_1d28 = -(uint)((float)local_2f8 < 0.70710677);
        iStack_1d24 = -(uint)(local_2f8._4_4_ < 0.70710677);
        iStack_1d20 = -(uint)((float)uStack_2f0 < 0.70710677);
        iStack_1d1c = -(uint)(uStack_2f0._4_4_ < 0.70710677);
        local_4c8 = CONCAT44(iStack_1d24,local_1d28);
        uStack_4c0 = CONCAT44(iStack_1d1c,iStack_1d20);
        uVar28 = local_fd8 & local_4c8;
        uVar34 = uStack_fd0 & uStack_4c0;
        local_fe8 = 0x3f8000003f800000;
        uStack_fe0 = 0x3f8000003f800000;
        local_1cd8 = CONCAT44(local_2f8._4_4_ - 1.0,(float)local_2f8 - 1.0);
        uStack_1cd0._0_4_ = (float)uStack_2f0 - 1.0;
        uStack_1cd0._4_4_ = uStack_2f0._4_4_ - 1.0;
        local_ff8 = CONCAT44(fStack_1d14,local_1d18);
        uStack_ff0 = CONCAT44(fStack_1d0c,fStack_1d10);
        local_4d8 = 0x3f8000003f800000;
        uStack_4d0 = 0x3f8000003f800000;
        local_4e8 = CONCAT44(iStack_1d24,local_1d28);
        uStack_4e0 = CONCAT44(iStack_1d1c,iStack_1d20);
        uVar29 = local_4e8 & 0x3f8000003f800000;
        uVar35 = uStack_4e0 & 0x3f8000003f800000;
        local_1008._0_4_ = (float)uVar29;
        local_1008._4_4_ = (float)(uVar29 >> 0x20);
        uStack_1000._0_4_ = (float)uVar35;
        uStack_1000._4_4_ = (float)(uVar35 >> 0x20);
        local_1d18 = local_1d18 - (float)local_1008;
        fStack_1d14 = fStack_1d14 - local_1008._4_4_;
        fStack_1d10 = fStack_1d10 - (float)uStack_1000;
        fStack_1d0c = fStack_1d0c - uStack_1000._4_4_;
        local_1998 = local_1cd8;
        uStack_1990 = uStack_1cd0;
        local_19a8._0_4_ = (float)uVar28;
        local_19a8._4_4_ = (float)(uVar28 >> 0x20);
        uStack_19a0._0_4_ = (float)uVar34;
        uStack_19a0._4_4_ = (float)(uVar34 >> 0x20);
        local_19a8._0_4_ = ((float)local_2f8 - 1.0) + (float)local_19a8;
        local_19a8._4_4_ = (local_2f8._4_4_ - 1.0) + local_19a8._4_4_;
        uStack_19a0._0_4_ = ((float)uStack_2f0 - 1.0) + (float)uStack_19a0;
        uStack_19a0._4_4_ = (uStack_2f0._4_4_ - 1.0) + uStack_19a0._4_4_;
        local_1cd8 = CONCAT44(local_19a8._4_4_,(float)local_19a8);
        uStack_1cd0._0_4_ = (float)uStack_19a0;
        uStack_1cd0._4_4_ = uStack_19a0._4_4_;
        local_1b28 = local_1cd8;
        uStack_1b20 = uStack_1cd0;
        local_1d48 = (float)local_19a8 * (float)local_19a8;
        fStack_1d44 = local_19a8._4_4_ * local_19a8._4_4_;
        fStack_1d40 = (float)uStack_19a0 * (float)uStack_19a0;
        fStack_1d3c = uStack_19a0._4_4_ * uStack_19a0._4_4_;
        local_1b38 = 0x3d9021bb3d9021bb;
        uStack_1b30 = 0x3d9021bb3d9021bb;
        local_1b48 = local_1cd8;
        uStack_1b40 = uStack_1cd0;
        local_1d58 = CONCAT44(local_19a8._4_4_ * 0.070376836,(float)local_19a8 * 0.070376836);
        uStack_1d50 = CONCAT44(uStack_19a0._4_4_ * 0.070376836,(float)uStack_19a0 * 0.070376836);
        local_19b8 = local_1d58;
        uStack_19b0 = uStack_1d50;
        local_19c8 = 0xbdebd1b8bdebd1b8;
        uStack_19c0 = 0xbdebd1b8bdebd1b8;
        fVar27 = (float)local_19a8 * 0.070376836 + -0.1151461;
        fVar32 = local_19a8._4_4_ * 0.070376836 + -0.1151461;
        fVar33 = (float)uStack_19a0 * 0.070376836 + -0.1151461;
        fVar36 = uStack_19a0._4_4_ * 0.070376836 + -0.1151461;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1b58 = local_1d58;
        uStack_1b50 = uStack_1d50;
        local_1b68 = local_1cd8;
        uStack_1b60 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_19d8 = local_1d58;
        uStack_19d0 = uStack_1d50;
        local_19e8 = 0x3def251a3def251a;
        uStack_19e0 = 0x3def251a3def251a;
        fVar27 = fVar27 + 0.116769984;
        fVar32 = fVar32 + 0.116769984;
        fVar33 = fVar33 + 0.116769984;
        fVar36 = fVar36 + 0.116769984;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1b78 = local_1d58;
        uStack_1b70 = uStack_1d50;
        local_1b88 = local_1cd8;
        uStack_1b80 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_19f8 = local_1d58;
        uStack_19f0 = uStack_1d50;
        local_1a08 = 0xbdfe5d4fbdfe5d4f;
        uStack_1a00 = 0xbdfe5d4fbdfe5d4f;
        fVar27 = fVar27 + -0.12420141;
        fVar32 = fVar32 + -0.12420141;
        fVar33 = fVar33 + -0.12420141;
        fVar36 = fVar36 + -0.12420141;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1b98 = local_1d58;
        uStack_1b90 = uStack_1d50;
        local_1ba8 = local_1cd8;
        uStack_1ba0 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1a18 = local_1d58;
        uStack_1a10 = uStack_1d50;
        local_1a28 = 0x3e11e9bf3e11e9bf;
        uStack_1a20 = 0x3e11e9bf3e11e9bf;
        fVar27 = fVar27 + 0.14249323;
        fVar32 = fVar32 + 0.14249323;
        fVar33 = fVar33 + 0.14249323;
        fVar36 = fVar36 + 0.14249323;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1bb8 = local_1d58;
        uStack_1bb0 = uStack_1d50;
        local_1bc8 = local_1cd8;
        uStack_1bc0 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1a38 = local_1d58;
        uStack_1a30 = uStack_1d50;
        local_1a48 = 0xbe2aae50be2aae50;
        uStack_1a40 = 0xbe2aae50be2aae50;
        fVar27 = fVar27 + -0.16668057;
        fVar32 = fVar32 + -0.16668057;
        fVar33 = fVar33 + -0.16668057;
        fVar36 = fVar36 + -0.16668057;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1bd8 = local_1d58;
        uStack_1bd0 = uStack_1d50;
        local_1be8 = local_1cd8;
        uStack_1be0 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1a58 = local_1d58;
        uStack_1a50 = uStack_1d50;
        local_1a68 = 0x3e4cceac3e4cceac;
        uStack_1a60 = 0x3e4cceac3e4cceac;
        fVar27 = fVar27 + 0.20000714;
        fVar32 = fVar32 + 0.20000714;
        fVar33 = fVar33 + 0.20000714;
        fVar36 = fVar36 + 0.20000714;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1bf8 = local_1d58;
        uStack_1bf0 = uStack_1d50;
        local_1c08 = local_1cd8;
        uStack_1c00 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1a78 = local_1d58;
        uStack_1a70 = uStack_1d50;
        local_1a88 = 0xbe7ffffcbe7ffffc;
        uStack_1a80 = 0xbe7ffffcbe7ffffc;
        fVar27 = fVar27 + -0.24999994;
        fVar32 = fVar32 + -0.24999994;
        fVar33 = fVar33 + -0.24999994;
        fVar36 = fVar36 + -0.24999994;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1c18 = local_1d58;
        uStack_1c10 = uStack_1d50;
        local_1c28 = local_1cd8;
        uStack_1c20 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1a98 = local_1d58;
        uStack_1a90 = uStack_1d50;
        local_1aa8 = 0x3eaaaaaa3eaaaaaa;
        uStack_1aa0 = 0x3eaaaaaa3eaaaaaa;
        fVar27 = fVar27 + 0.3333333;
        fVar32 = fVar32 + 0.3333333;
        fVar33 = fVar33 + 0.3333333;
        fVar36 = fVar36 + 0.3333333;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1c38 = local_1d58;
        uStack_1c30 = uStack_1d50;
        local_1c48 = local_1cd8;
        uStack_1c40 = uStack_1cd0;
        fVar27 = fVar27 * (float)local_19a8;
        fVar32 = fVar32 * local_19a8._4_4_;
        fVar33 = fVar33 * (float)uStack_19a0;
        fVar36 = fVar36 * uStack_19a0._4_4_;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1c58 = local_1d58;
        uStack_1c50 = uStack_1d50;
        local_1c68 = CONCAT44(fStack_1d44,local_1d48);
        uStack_1c60 = CONCAT44(fStack_1d3c,fStack_1d40);
        fVar27 = fVar27 * local_1d48;
        fVar32 = fVar32 * fStack_1d44;
        fVar33 = fVar33 * fStack_1d40;
        fVar36 = fVar36 * fStack_1d3c;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1c78 = CONCAT44(fStack_1d14,local_1d18);
        uStack_1c70 = CONCAT44(fStack_1d0c,fStack_1d10);
        local_1d38 = CONCAT44(fStack_1d14 * -0.00021219444,local_1d18 * -0.00021219444);
        uStack_1d30 = CONCAT44(fStack_1d0c * -0.00021219444,fStack_1d10 * -0.00021219444);
        local_1ab8 = local_1d58;
        uStack_1ab0 = uStack_1d50;
        local_1ac8 = local_1d38;
        uStack_1ac0 = uStack_1d30;
        fVar27 = fVar27 + local_1d18 * -0.00021219444;
        fVar32 = fVar32 + fStack_1d14 * -0.00021219444;
        fVar33 = fVar33 + fStack_1d10 * -0.00021219444;
        fVar36 = fVar36 + fStack_1d0c * -0.00021219444;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1c98 = CONCAT44(fStack_1d44,local_1d48);
        uStack_1c90 = CONCAT44(fStack_1d3c,fStack_1d40);
        local_1d38 = CONCAT44(fStack_1d44 * 0.5,local_1d48 * 0.5);
        uStack_1d30 = CONCAT44(fStack_1d3c * 0.5,fStack_1d40 * 0.5);
        local_1018 = local_1d58;
        uStack_1010 = uStack_1d50;
        local_1028 = local_1d38;
        uStack_1020 = uStack_1d30;
        fVar27 = fVar27 - local_1d48 * 0.5;
        fVar32 = fVar32 - fStack_1d44 * 0.5;
        fVar33 = fVar33 - fStack_1d40 * 0.5;
        fVar36 = fVar36 - fStack_1d3c * 0.5;
        local_1d58 = CONCAT44(fVar32,fVar27);
        uStack_1d50 = CONCAT44(fVar36,fVar33);
        local_1cb8 = CONCAT44(fStack_1d14,local_1d18);
        uStack_1cb0 = CONCAT44(fStack_1d0c,fStack_1d10);
        local_1d38 = CONCAT44(fStack_1d14 * 0.6933594,local_1d18 * 0.6933594);
        uStack_1d30 = CONCAT44(fStack_1d0c * 0.6933594,fStack_1d10 * 0.6933594);
        local_1ad8 = local_1cd8;
        uStack_1ad0 = uStack_1cd0;
        local_1ae8 = local_1d58;
        uStack_1ae0 = uStack_1d50;
        local_19a8._0_4_ = (float)local_19a8 + fVar27;
        local_19a8._4_4_ = local_19a8._4_4_ + fVar32;
        uStack_19a0._0_4_ = (float)uStack_19a0 + fVar33;
        uStack_19a0._4_4_ = uStack_19a0._4_4_ + fVar36;
        local_1cd8 = CONCAT44(local_19a8._4_4_,(float)local_19a8);
        uStack_1cd0._0_4_ = (float)uStack_19a0;
        uStack_1cd0._4_4_ = uStack_19a0._4_4_;
        local_1af8 = local_1cd8;
        uStack_1af0 = uStack_1cd0;
        local_1b08 = local_1d38;
        uStack_1b00 = uStack_1d30;
        local_1cd8 = CONCAT44(local_19a8._4_4_ + fStack_1d14 * 0.6933594,
                              (float)local_19a8 + local_1d18 * 0.6933594);
        uStack_1cd0._0_4_ = (float)uStack_19a0 + fStack_1d10 * 0.6933594;
        uStack_1cd0._4_4_ = uStack_19a0._4_4_ + fStack_1d0c * 0.6933594;
        local_418 = local_1cd8;
        uStack_410 = uStack_1cd0;
        local_428 = CONCAT44(iStack_1d04,local_1d08);
        uStack_420 = CONCAT44(iStack_1cfc,iStack_1d00);
        local_1ff8 = local_1cd8 | local_428;
        uStack_1ff0 = uStack_1cd0 | uStack_420;
        uStack_1cd0 = uStack_1ff0;
        local_1cd8 = local_1ff8;
        local_116c = 0x3f800000;
        local_1188 = 0x3f800000;
        local_2008 = 0x3f8000003f800000;
        uStack_2000 = 0x3f8000003f800000;
        local_118c = 0x40000000;
        local_11a8 = 0x40000000;
        local_2018 = 0x4000000040000000;
        uStack_2010 = 0x4000000040000000;
        local_1fb8._0_4_ = (float)local_1ff8;
        local_1fb8._4_4_ = (float)(local_1ff8 >> 0x20);
        uStack_1fb0._0_4_ = (float)uStack_1ff0;
        uStack_1fb0._4_4_ = (float)(uStack_1ff0 >> 0x20);
        local_f18 = (float)local_1fb8 * 2.0;
        fStack_f14 = local_1fb8._4_4_ * 2.0;
        fStack_f10 = (float)uStack_1fb0 * 2.0;
        fStack_f0c = uStack_1fb0._4_4_ * 2.0;
        local_bdc = 0x3f800000;
        local_bf8 = 0x3f800000;
        local_f28 = 0x3f8000003f800000;
        uStack_f20 = 0x3f8000003f800000;
        local_718 = 0;
        uStack_710 = 0;
        local_b68 = 0;
        uStack_b60 = 0;
        local_b78 = CONCAT44(fStack_f14,local_f18);
        uStack_b70 = CONCAT44(fStack_f0c,fStack_f10);
        local_e68 = CONCAT44(0.0 - fStack_f14,0.0 - local_f18);
        uStack_e60._0_4_ = 0.0 - fStack_f10;
        uStack_e60._4_4_ = 0.0 - fStack_f0c;
        local_728 = 0;
        uStack_720 = 0;
        local_128 = 0x7f0000007f;
        uStack_120 = 0x7f0000007f;
        local_298 = local_e68;
        uStack_290 = uStack_e60;
        auVar20._8_8_ = uStack_e60;
        auVar20._0_8_ = local_e68;
        auVar19._8_8_ = 0x42b0c0a542b0c0a5;
        auVar19._0_8_ = 0x42b0c0a542b0c0a5;
        auVar31 = minps(auVar20,auVar19);
        local_e68 = auVar31._0_8_;
        local_658 = local_e68;
        uStack_e60 = auVar31._8_8_;
        uStack_650 = uStack_e60;
        auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar31 = maxps(auVar31,auVar10);
        local_e68 = auVar31._0_8_;
        uVar5 = local_e68;
        uStack_e60 = auVar31._8_8_;
        uVar6 = uStack_e60;
        local_d08._0_4_ = auVar31._0_4_;
        local_d08._4_4_ = auVar31._4_4_;
        uStack_d00._0_4_ = auVar31._8_4_;
        uStack_d00._4_4_ = auVar31._12_4_;
        local_c08 = CONCAT44(local_d08._4_4_ * 1.442695,(float)local_d08 * 1.442695);
        uStack_c00 = CONCAT44(uStack_d00._4_4_ * 1.442695,(float)uStack_d00 * 1.442695);
        fVar27 = (float)local_d08 * 1.442695 + 0.5;
        fVar32 = local_d08._4_4_ * 1.442695 + 0.5;
        fVar33 = (float)uStack_d00 * 1.442695 + 0.5;
        fVar36 = uStack_d00._4_4_ * 1.442695 + 0.5;
        local_218 = CONCAT44(fVar32,fVar27);
        uStack_210 = CONCAT44(fVar36,fVar33);
        local_358 = CONCAT44((int)fVar32,(int)fVar27);
        uStack_350 = CONCAT44((int)fVar36,(int)fVar33);
        local_e88 = (float)(int)fVar27;
        fStack_e84 = (float)(int)fVar32;
        fStack_e80 = (float)(int)fVar33;
        fStack_e7c = (float)(int)fVar36;
        local_e78 = CONCAT44(fStack_e84,local_e88);
        uStack_e70 = CONCAT44(fStack_e7c,fStack_e80);
        local_198 = local_e78;
        uStack_190 = uStack_e70;
        local_1a8 = CONCAT44(fVar32,fVar27);
        uStack_1a0 = CONCAT44(fVar36,fVar33);
        local_eb8 = CONCAT44(-(uint)(fVar32 < fStack_e84),-(uint)(fVar27 < local_e88));
        uStack_eb0 = CONCAT44(-(uint)(fVar36 < fStack_e7c),-(uint)(fVar33 < fStack_e80));
        local_538 = local_eb8;
        uStack_530 = uStack_eb0;
        local_548 = 0x3f8000003f800000;
        uStack_540 = 0x3f8000003f800000;
        local_eb8 = local_eb8 & 0x3f8000003f800000;
        uStack_eb0 = uStack_eb0 & 0x3f8000003f800000;
        local_b88 = local_e78;
        uStack_b80 = uStack_e70;
        local_b98._0_4_ = (float)local_eb8;
        local_b98._4_4_ = (float)(local_eb8 >> 0x20);
        uStack_b90._0_4_ = (float)uStack_eb0;
        uStack_b90._4_4_ = (float)(uStack_eb0 >> 0x20);
        local_e88 = local_e88 - (float)local_b98;
        fStack_e84 = fStack_e84 - local_b98._4_4_;
        fStack_e80 = fStack_e80 - (float)uStack_b90;
        fStack_e7c = fStack_e7c - uStack_b90._4_4_;
        local_d28 = CONCAT44(fStack_e84,local_e88);
        uStack_d20 = CONCAT44(fStack_e7c,fStack_e80);
        local_e78 = CONCAT44(fStack_e84 * 0.6933594,local_e88 * 0.6933594);
        uStack_e70 = CONCAT44(fStack_e7c * 0.6933594,fStack_e80 * 0.6933594);
        local_d48 = CONCAT44(fStack_e84,local_e88);
        uStack_d40 = CONCAT44(fStack_e7c,fStack_e80);
        local_ba8 = local_e68;
        uStack_ba0 = uStack_e60;
        local_bb8 = local_e78;
        uStack_bb0 = uStack_e70;
        local_d08._0_4_ = (float)local_d08 - local_e88 * 0.6933594;
        local_d08._4_4_ = local_d08._4_4_ - fStack_e84 * 0.6933594;
        uStack_d00._0_4_ = (float)uStack_d00 - fStack_e80 * 0.6933594;
        uStack_d00._4_4_ = uStack_d00._4_4_ - fStack_e7c * 0.6933594;
        local_e68 = CONCAT44(local_d08._4_4_,(float)local_d08);
        uStack_e60._0_4_ = (float)uStack_d00;
        uStack_e60._4_4_ = uStack_d00._4_4_;
        local_bc8 = local_e68;
        uStack_bc0 = uStack_e60;
        local_bd8 = CONCAT44(fStack_e84 * -0.00021219444,local_e88 * -0.00021219444);
        uStack_bd0 = CONCAT44(fStack_e7c * -0.00021219444,fStack_e80 * -0.00021219444);
        local_d08._0_4_ = (float)local_d08 - local_e88 * -0.00021219444;
        local_d08._4_4_ = local_d08._4_4_ - fStack_e84 * -0.00021219444;
        uStack_d00._0_4_ = (float)uStack_d00 - fStack_e80 * -0.00021219444;
        uStack_d00._4_4_ = uStack_d00._4_4_ - fStack_e7c * -0.00021219444;
        local_e68 = CONCAT44(local_d08._4_4_,(float)local_d08);
        uStack_e60._0_4_ = (float)uStack_d00;
        uStack_e60._4_4_ = uStack_d00._4_4_;
        local_d78 = local_e68;
        uStack_d70 = uStack_e60;
        local_ec8 = (float)local_d08 * (float)local_d08;
        fStack_ec4 = local_d08._4_4_ * local_d08._4_4_;
        fStack_ec0 = (float)uStack_d00 * (float)uStack_d00;
        fStack_ebc = uStack_d00._4_4_ * uStack_d00._4_4_;
        local_d88 = 0x3950696739506967;
        uStack_d80 = 0x3950696739506967;
        local_d98 = local_e68;
        uStack_d90 = uStack_e60;
        local_ed8 = CONCAT44(local_d08._4_4_ * 0.00019875691,(float)local_d08 * 0.00019875691);
        uStack_ed0 = CONCAT44(uStack_d00._4_4_ * 0.00019875691,(float)uStack_d00 * 0.00019875691);
        local_c28 = local_ed8;
        uStack_c20 = uStack_ed0;
        local_768 = (float)local_d08 * 0.00019875691 + 0.0013981999;
        fStack_764 = local_d08._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_760 = (float)uStack_d00 * 0.00019875691 + 0.0013981999;
        fStack_75c = uStack_d00._4_4_ * 0.00019875691 + 0.0013981999;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_da8 = local_ed8;
        uStack_da0 = uStack_ed0;
        local_db8 = local_e68;
        uStack_db0 = uStack_e60;
        local_768 = local_768 * (float)local_d08;
        fStack_764 = fStack_764 * local_d08._4_4_;
        fStack_760 = fStack_760 * (float)uStack_d00;
        fStack_75c = fStack_75c * uStack_d00._4_4_;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_c48 = local_ed8;
        uStack_c40 = uStack_ed0;
        local_768 = local_768 + 0.008333452;
        fStack_764 = fStack_764 + 0.008333452;
        fStack_760 = fStack_760 + 0.008333452;
        fStack_75c = fStack_75c + 0.008333452;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_dc8 = local_ed8;
        uStack_dc0 = uStack_ed0;
        local_dd8 = local_e68;
        uStack_dd0 = uStack_e60;
        local_768 = local_768 * (float)local_d08;
        fStack_764 = fStack_764 * local_d08._4_4_;
        fStack_760 = fStack_760 * (float)uStack_d00;
        fStack_75c = fStack_75c * uStack_d00._4_4_;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_c68 = local_ed8;
        uStack_c60 = uStack_ed0;
        local_768 = local_768 + 0.041665796;
        fStack_764 = fStack_764 + 0.041665796;
        fStack_760 = fStack_760 + 0.041665796;
        fStack_75c = fStack_75c + 0.041665796;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_de8 = local_ed8;
        uStack_de0 = uStack_ed0;
        local_df8 = local_e68;
        uStack_df0 = uStack_e60;
        local_768 = local_768 * (float)local_d08;
        fStack_764 = fStack_764 * local_d08._4_4_;
        fStack_760 = fStack_760 * (float)uStack_d00;
        fStack_75c = fStack_75c * uStack_d00._4_4_;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_c88 = local_ed8;
        uStack_c80 = uStack_ed0;
        local_768 = local_768 + 0.16666666;
        fStack_764 = fStack_764 + 0.16666666;
        fStack_760 = fStack_760 + 0.16666666;
        fStack_75c = fStack_75c + 0.16666666;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_e08 = local_ed8;
        uStack_e00 = uStack_ed0;
        local_e18 = local_e68;
        uStack_e10 = uStack_e60;
        local_768 = local_768 * (float)local_d08;
        fStack_764 = fStack_764 * local_d08._4_4_;
        fStack_760 = fStack_760 * (float)uStack_d00;
        fStack_75c = fStack_75c * uStack_d00._4_4_;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_ca8 = local_ed8;
        uStack_ca0 = uStack_ed0;
        local_768 = local_768 + 0.5;
        fStack_764 = fStack_764 + 0.5;
        fStack_760 = fStack_760 + 0.5;
        fStack_75c = fStack_75c + 0.5;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_e28 = local_ed8;
        uStack_e20 = uStack_ed0;
        local_e38 = CONCAT44(fStack_ec4,local_ec8);
        uStack_e30 = CONCAT44(fStack_ebc,fStack_ec0);
        local_768 = local_768 * local_ec8;
        fStack_764 = fStack_764 * fStack_ec4;
        fStack_760 = fStack_760 * fStack_ec0;
        fStack_75c = fStack_75c * fStack_ebc;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_cc8 = local_ed8;
        uStack_cc0 = uStack_ed0;
        local_cd8 = local_e68;
        uStack_cd0 = uStack_e60;
        local_768 = local_768 + (float)local_d08;
        fStack_764 = fStack_764 + local_d08._4_4_;
        fStack_760 = fStack_760 + (float)uStack_d00;
        fStack_75c = fStack_75c + uStack_d00._4_4_;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_ce8 = local_ed8;
        uStack_ce0 = uStack_ed0;
        local_cf8 = 0x3f8000003f800000;
        uStack_cf0 = 0x3f8000003f800000;
        local_768 = local_768 + 1.0;
        fStack_764 = fStack_764 + 1.0;
        fStack_760 = fStack_760 + 1.0;
        fStack_75c = fStack_75c + 1.0;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_228 = CONCAT44(fStack_e84,local_e88);
        uStack_220 = CONCAT44(fStack_e7c,fStack_e80);
        local_118 = CONCAT44((int)fStack_e84,(int)local_e88);
        uStack_110 = CONCAT44((int)fStack_e7c,(int)fStack_e80);
        iVar37 = (int)local_e88 + 0x7f;
        fStack_e94 = (float)((int)fStack_e84 + 0x7f);
        fStack_e90 = (float)((int)fStack_e80 + 0x7f);
        fStack_e8c = (float)((int)fStack_e7c + 0x7f);
        local_98 = CONCAT44(fStack_e94,iVar37);
        uStack_90 = CONCAT44(fStack_e8c,fStack_e90);
        local_9c = 0x17;
        local_e98 = (float)(iVar37 * 0x800000);
        local_ee8 = CONCAT44(fStack_e94,local_e98);
        uStack_ee0 = CONCAT44(fStack_e8c,fStack_e90);
        local_e48 = local_ed8;
        uStack_e40 = uStack_ed0;
        local_768 = local_768 * local_e98;
        fStack_764 = fStack_764 * fStack_e94;
        fStack_760 = fStack_760 * fStack_e90;
        fStack_75c = fStack_75c * fStack_e8c;
        local_ed8 = CONCAT44(fStack_764,local_768);
        uStack_ed0 = CONCAT44(fStack_75c,fStack_760);
        local_f08 = local_ed8;
        uStack_f00 = uStack_ed0;
        local_768 = local_768 + 1.0;
        fStack_764 = fStack_764 + 1.0;
        fStack_760 = fStack_760 + 1.0;
        fStack_75c = fStack_75c + 1.0;
        auVar30._8_8_ = 0x3f8000003f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar31._4_4_ = fStack_764;
        auVar31._0_4_ = local_768;
        auVar31._8_4_ = fStack_760;
        auVar31._12_4_ = fStack_75c;
        _local_1fd8 = divps(auVar30,auVar31);
        local_f58 = (float)local_1fd8._0_4_ * 2.0;
        fStack_f54 = (float)local_1fd8._4_4_ * 2.0;
        fStack_f50 = fStack_1fd0 * 2.0;
        fStack_f4c = fStack_1fcc * 2.0;
        local_20a8 = local_f58 - 1.0;
        fStack_20a4 = fStack_f54 - 1.0;
        fStack_20a0 = fStack_f50 - 1.0;
        fStack_209c = fStack_f4c - 1.0;
        local_2098._0_4_ = (undefined4)local_2128;
        local_2098._4_4_ = (undefined4)((ulong)local_2128 >> 0x20);
        fStack_2090 = (float)uStack_2120;
        fStack_208c = (float)((ulong)uStack_2120 >> 0x20);
        local_2258 = CONCAT44((float)local_2098._4_4_ * fStack_20a4,
                              (float)local_2098._0_4_ * local_20a8);
        uStack_2250 = CONCAT44(fStack_208c * fStack_209c,fStack_2090 * fStack_20a0);
        local_20f0 = local_21f8;
        local_2108 = local_2258;
        uStack_2100 = uStack_2250;
        *(undefined8 *)*local_21f8 = local_2258;
        *(undefined8 *)(*local_21f8 + 8) = uStack_2250;
        local_21f8 = local_21f8 + 1;
        _local_2098 = auVar25;
        local_1fe8 = local_2018;
        uStack_1fe0 = uStack_2010;
        local_1fc8 = local_2018;
        uStack_1fc0 = uStack_2010;
        local_1fb8 = local_1ff8;
        uStack_1fb0 = uStack_1ff0;
        local_1b18 = local_1b28;
        uStack_1b10 = uStack_1b20;
        local_19a8 = uVar28;
        uStack_19a0 = uVar34;
        local_1458 = local_1cf8;
        uStack_1450 = uStack_1cf0;
        local_1408 = local_1498;
        uStack_1400 = uStack_1490;
        local_1318 = local_1328;
        uStack_1310 = uStack_1320;
        local_1308 = local_1c88;
        uStack_1300 = uStack_1c80;
        local_12e8 = local_1cc8;
        uStack_12e0 = uStack_1cc0;
        local_12b8 = uVar1;
        uStack_12b0 = uVar2;
        local_1268 = local_1ca8;
        uStack_1260 = uStack_1ca0;
        local_11c8 = local_1ca8;
        uStack_11c0 = uStack_1ca0;
        uStack_11a4 = local_11a8;
        uStack_11a0 = local_11a8;
        uStack_119c = local_11a8;
        uStack_1184 = local_1188;
        uStack_1180 = local_1188;
        uStack_117c = local_1188;
        uStack_1104 = local_1108;
        uStack_1100 = local_1108;
        uStack_10fc = local_1108;
        local_10a8 = local_1468;
        uStack_10a0 = uStack_1460;
        local_1008 = uVar29;
        uStack_1000 = uVar35;
        local_f68 = local_2008;
        uStack_f60 = uStack_2000;
        local_ef8 = local_f28;
        uStack_ef0 = uStack_f20;
        local_ea8 = local_1cf8;
        uStack_ea0 = uStack_1cf0;
        local_e58 = local_ee8;
        uStack_e50 = uStack_ee0;
        local_d68 = local_d78;
        uStack_d60 = uStack_d70;
        local_d58 = local_1c88;
        uStack_d50 = uStack_1c80;
        local_d38 = local_1cc8;
        uStack_d30 = uStack_1cc0;
        local_d18 = local_12c8;
        uStack_d10 = uStack_12c0;
        local_d08 = uVar5;
        uStack_d00 = uVar6;
        local_cb8 = local_1ca8;
        uStack_cb0 = uStack_1ca0;
        local_c98 = local_1248;
        uStack_c90 = uStack_1240;
        local_c78 = local_1228;
        uStack_c70 = uStack_1220;
        local_c58 = local_1208;
        uStack_c50 = uStack_1200;
        local_c38 = local_11e8;
        uStack_c30 = uStack_11e0;
        local_c18 = local_1ca8;
        uStack_c10 = uStack_1ca0;
        uStack_bf4 = local_bf8;
        uStack_bf0 = local_bf8;
        uStack_bec = local_bf8;
        local_b98 = local_eb8;
        uStack_b90 = uStack_eb0;
        local_758 = local_f28;
        uStack_750 = uStack_f20;
        local_648 = local_668;
        uStack_640 = uStack_660;
        local_5b8 = uVar3;
        uStack_5b0 = uVar4;
        local_4b8 = local_fd8;
        uStack_4b0 = uStack_fd0;
        local_408 = local_1ca8;
        uStack_400 = uStack_1ca0;
        local_3a8 = in_stack_ffffffffffffdd48;
        local_2f8 = local_fd8;
        uStack_2f0 = uStack_fd0;
        local_288 = local_2a8;
        uStack_280 = uStack_2a0;
        local_278 = local_2128;
        uStack_270 = uStack_2120;
        local_108 = in_stack_ffffffffffffdd48;
        uStack_100 = uStack_3a0;
        local_38 = local_ee8;
        uStack_30 = uStack_ee0;
        local_28 = local_1498;
        uStack_20 = uStack_1490;
      }
      for (; local_2244 < local_2168; local_2244 = local_2244 + 1) {
        fVar27 = *(float *)*local_21f8;
        auVar25._0_8_ = std::exp((double)(ulong)*(uint *)*local_21f8);
        auVar25._8_8_ = extraout_XMM0_Qb;
        auVar26._4_12_ = auVar25._4_12_;
        auVar26._0_4_ = SUB84(auVar25._0_8_,0) + 1.0;
        dVar24 = std::log(auVar26._0_8_);
        dVar24 = std::tanh(dVar24);
        *(float *)*local_21f8 = fVar27 * SUB84(dVar24,0);
        local_21f8 = (undefined1 (*) [16])(*local_21f8 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}